

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  undefined1 auVar5 [16];
  Primitive PVar6;
  uint uVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  RTCRayQueryContext *pRVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  ulong uVar82;
  byte bVar83;
  byte bVar84;
  ulong uVar85;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  uint uVar86;
  long lVar87;
  bool bVar88;
  ulong uVar89;
  uint uVar90;
  uint uVar145;
  uint uVar146;
  uint uVar148;
  uint uVar149;
  uint uVar150;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  uint uVar147;
  uint uVar151;
  undefined1 auVar138 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar139 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar144 [32];
  float pp;
  float fVar152;
  float fVar153;
  undefined4 uVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar196;
  float fVar197;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar215;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar213;
  float fVar214;
  undefined1 auVar212 [64];
  float fVar216;
  float fVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  float fVar237;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar238 [64];
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar239 [32];
  float fVar243;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [64];
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar248 [64];
  float fVar252;
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [16];
  float fVar257;
  undefined1 auVar256 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [16];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_990;
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 (*local_928) [32];
  Primitive *local_920;
  ulong local_918;
  ulong local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  float local_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  float local_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  RTCHitN local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 uStack_140;
  float afStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar132 [32];
  undefined1 auVar140 [32];
  undefined1 auVar143 [32];
  
  PVar6 = prim[1];
  uVar82 = (ulong)(byte)PVar6;
  fVar217 = *(float *)(prim + uVar82 * 0x19 + 0x12);
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar97 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar96 = vsubps_avx(auVar93,*(undefined1 (*) [16])(prim + uVar82 * 0x19 + 6));
  fVar216 = fVar217 * auVar96._0_4_;
  fVar152 = fVar217 * auVar97._0_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar82 * 4 + 6);
  auVar105 = vpmovsxbd_avx2(auVar93);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar82 * 5 + 6);
  auVar103 = vpmovsxbd_avx2(auVar19);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar82 * 6 + 6);
  auVar106 = vpmovsxbd_avx2(auVar94);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar253._8_8_ = 0;
  auVar253._0_8_ = *(ulong *)(prim + uVar82 * 0xb + 6);
  auVar107 = vpmovsxbd_avx2(auVar253);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar112 = vpmovsxbd_avx2(auVar91);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar108 = vcvtdq2ps_avx(auVar112);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar82 + 6);
  auVar104 = vpmovsxbd_avx2(auVar5);
  auVar104 = vcvtdq2ps_avx(auVar104);
  uVar89 = (ulong)(uint)((int)(uVar82 * 9) * 2);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar109 = vpmovsxbd_avx2(auVar95);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar89 + uVar82 + 6);
  auVar110 = vpmovsxbd_avx2(auVar92);
  auVar110 = vcvtdq2ps_avx(auVar110);
  uVar85 = (ulong)(uint)((int)(uVar82 * 5) << 2);
  auVar266._8_8_ = 0;
  auVar266._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar102 = vpmovsxbd_avx2(auVar266);
  auVar111 = vcvtdq2ps_avx(auVar102);
  auVar259 = ZEXT3264(auVar111);
  auVar122._4_4_ = fVar152;
  auVar122._0_4_ = fVar152;
  auVar122._8_4_ = fVar152;
  auVar122._12_4_ = fVar152;
  auVar122._16_4_ = fVar152;
  auVar122._20_4_ = fVar152;
  auVar122._24_4_ = fVar152;
  auVar122._28_4_ = fVar152;
  auVar208._8_4_ = 1;
  auVar208._0_8_ = 0x100000001;
  auVar208._12_4_ = 1;
  auVar208._16_4_ = 1;
  auVar208._20_4_ = 1;
  auVar208._24_4_ = 1;
  auVar208._28_4_ = 1;
  auVar100 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar114 = ZEXT1632(CONCAT412(fVar217 * auVar97._12_4_,
                                CONCAT48(fVar217 * auVar97._8_4_,
                                         CONCAT44(fVar217 * auVar97._4_4_,fVar152))));
  auVar113 = vpermps_avx2(auVar208,auVar114);
  auVar101 = vpermps_avx512vl(auVar100,auVar114);
  fVar152 = auVar101._0_4_;
  fVar240 = auVar101._4_4_;
  auVar114._4_4_ = fVar240 * auVar106._4_4_;
  auVar114._0_4_ = fVar152 * auVar106._0_4_;
  fVar241 = auVar101._8_4_;
  auVar114._8_4_ = fVar241 * auVar106._8_4_;
  fVar242 = auVar101._12_4_;
  auVar114._12_4_ = fVar242 * auVar106._12_4_;
  fVar249 = auVar101._16_4_;
  auVar114._16_4_ = fVar249 * auVar106._16_4_;
  fVar250 = auVar101._20_4_;
  auVar114._20_4_ = fVar250 * auVar106._20_4_;
  fVar251 = auVar101._24_4_;
  auVar114._24_4_ = fVar251 * auVar106._24_4_;
  auVar114._28_4_ = auVar112._28_4_;
  auVar112._4_4_ = auVar104._4_4_ * fVar240;
  auVar112._0_4_ = auVar104._0_4_ * fVar152;
  auVar112._8_4_ = auVar104._8_4_ * fVar241;
  auVar112._12_4_ = auVar104._12_4_ * fVar242;
  auVar112._16_4_ = auVar104._16_4_ * fVar249;
  auVar112._20_4_ = auVar104._20_4_ * fVar250;
  auVar112._24_4_ = auVar104._24_4_ * fVar251;
  auVar112._28_4_ = auVar102._28_4_;
  auVar102._4_4_ = auVar111._4_4_ * fVar240;
  auVar102._0_4_ = auVar111._0_4_ * fVar152;
  auVar102._8_4_ = auVar111._8_4_ * fVar241;
  auVar102._12_4_ = auVar111._12_4_ * fVar242;
  auVar102._16_4_ = auVar111._16_4_ * fVar249;
  auVar102._20_4_ = auVar111._20_4_ * fVar250;
  auVar102._24_4_ = auVar111._24_4_ * fVar251;
  auVar102._28_4_ = auVar101._28_4_;
  auVar93 = vfmadd231ps_fma(auVar114,auVar113,auVar103);
  auVar19 = vfmadd231ps_fma(auVar112,auVar113,auVar108);
  auVar94 = vfmadd231ps_fma(auVar102,auVar110,auVar113);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar122,auVar105);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar122,auVar107);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar109,auVar122);
  auVar123._4_4_ = fVar216;
  auVar123._0_4_ = fVar216;
  auVar123._8_4_ = fVar216;
  auVar123._12_4_ = fVar216;
  auVar123._16_4_ = fVar216;
  auVar123._20_4_ = fVar216;
  auVar123._24_4_ = fVar216;
  auVar123._28_4_ = fVar216;
  auVar264 = ZEXT3264(auVar123);
  auVar102 = ZEXT1632(CONCAT412(fVar217 * auVar96._12_4_,
                                CONCAT48(fVar217 * auVar96._8_4_,
                                         CONCAT44(fVar217 * auVar96._4_4_,fVar216))));
  auVar112 = vpermps_avx2(auVar208,auVar102);
  auVar102 = vpermps_avx512vl(auVar100,auVar102);
  fVar217 = auVar102._0_4_;
  fVar152 = auVar102._4_4_;
  auVar113._4_4_ = fVar152 * auVar106._4_4_;
  auVar113._0_4_ = fVar217 * auVar106._0_4_;
  fVar240 = auVar102._8_4_;
  auVar113._8_4_ = fVar240 * auVar106._8_4_;
  fVar241 = auVar102._12_4_;
  auVar113._12_4_ = fVar241 * auVar106._12_4_;
  fVar242 = auVar102._16_4_;
  auVar113._16_4_ = fVar242 * auVar106._16_4_;
  fVar249 = auVar102._20_4_;
  auVar113._20_4_ = fVar249 * auVar106._20_4_;
  fVar250 = auVar102._24_4_;
  auVar113._24_4_ = fVar250 * auVar106._24_4_;
  auVar113._28_4_ = 1;
  auVar100._4_4_ = auVar104._4_4_ * fVar152;
  auVar100._0_4_ = auVar104._0_4_ * fVar217;
  auVar100._8_4_ = auVar104._8_4_ * fVar240;
  auVar100._12_4_ = auVar104._12_4_ * fVar241;
  auVar100._16_4_ = auVar104._16_4_ * fVar242;
  auVar100._20_4_ = auVar104._20_4_ * fVar249;
  auVar100._24_4_ = auVar104._24_4_ * fVar250;
  auVar100._28_4_ = auVar106._28_4_;
  auVar104._4_4_ = auVar111._4_4_ * fVar152;
  auVar104._0_4_ = auVar111._0_4_ * fVar217;
  auVar104._8_4_ = auVar111._8_4_ * fVar240;
  auVar104._12_4_ = auVar111._12_4_ * fVar241;
  auVar104._16_4_ = auVar111._16_4_ * fVar242;
  auVar104._20_4_ = auVar111._20_4_ * fVar249;
  auVar104._24_4_ = auVar111._24_4_ * fVar250;
  auVar104._28_4_ = auVar102._28_4_;
  auVar253 = vfmadd231ps_fma(auVar113,auVar112,auVar103);
  auVar91 = vfmadd231ps_fma(auVar100,auVar112,auVar108);
  auVar5 = vfmadd231ps_fma(auVar104,auVar112,auVar110);
  auVar253 = vfmadd231ps_fma(ZEXT1632(auVar253),auVar123,auVar105);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar123,auVar107);
  auVar119._8_4_ = 0x7fffffff;
  auVar119._0_8_ = 0x7fffffff7fffffff;
  auVar119._12_4_ = 0x7fffffff;
  auVar119._16_4_ = 0x7fffffff;
  auVar119._20_4_ = 0x7fffffff;
  auVar119._24_4_ = 0x7fffffff;
  auVar119._28_4_ = 0x7fffffff;
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar123,auVar109);
  auVar105 = vandps_avx(ZEXT1632(auVar93),auVar119);
  auVar121._8_4_ = 0x219392ef;
  auVar121._0_8_ = 0x219392ef219392ef;
  auVar121._12_4_ = 0x219392ef;
  auVar121._16_4_ = 0x219392ef;
  auVar121._20_4_ = 0x219392ef;
  auVar121._24_4_ = 0x219392ef;
  auVar121._28_4_ = 0x219392ef;
  uVar89 = vcmpps_avx512vl(auVar105,auVar121,1);
  bVar12 = (bool)((byte)uVar89 & 1);
  auVar101._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar93._0_4_;
  bVar12 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar93._4_4_;
  bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar93._8_4_;
  bVar12 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar93._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar19),auVar119);
  uVar89 = vcmpps_avx512vl(auVar105,auVar121,1);
  bVar12 = (bool)((byte)uVar89 & 1);
  auVar115._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._0_4_;
  bVar12 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._4_4_;
  bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._8_4_;
  bVar12 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar94),auVar119);
  uVar89 = vcmpps_avx512vl(auVar105,auVar121,1);
  bVar12 = (bool)((byte)uVar89 & 1);
  auVar105._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar94._0_4_;
  bVar12 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar94._4_4_;
  bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar94._8_4_;
  bVar12 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar94._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar103 = vrcp14ps_avx512vl(auVar101);
  auVar120._8_4_ = 0x3f800000;
  auVar120._0_8_ = &DAT_3f8000003f800000;
  auVar120._12_4_ = 0x3f800000;
  auVar120._16_4_ = 0x3f800000;
  auVar120._20_4_ = 0x3f800000;
  auVar120._24_4_ = 0x3f800000;
  auVar120._28_4_ = 0x3f800000;
  auVar93 = vfnmadd213ps_fma(auVar101,auVar103,auVar120);
  auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar115);
  auVar19 = vfnmadd213ps_fma(auVar115,auVar103,auVar120);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar105);
  auVar94 = vfnmadd213ps_fma(auVar105,auVar103,auVar120);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar103,auVar103);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 7 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar253));
  auVar109._4_4_ = auVar93._4_4_ * auVar105._4_4_;
  auVar109._0_4_ = auVar93._0_4_ * auVar105._0_4_;
  auVar109._8_4_ = auVar93._8_4_ * auVar105._8_4_;
  auVar109._12_4_ = auVar93._12_4_ * auVar105._12_4_;
  auVar109._16_4_ = auVar105._16_4_ * 0.0;
  auVar109._20_4_ = auVar105._20_4_ * 0.0;
  auVar109._24_4_ = auVar105._24_4_ * 0.0;
  auVar109._28_4_ = auVar105._28_4_;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 9 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar253));
  auVar104 = vpbroadcastd_avx512vl();
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar118._0_4_ = auVar93._0_4_ * auVar105._0_4_;
  auVar118._4_4_ = auVar93._4_4_ * auVar105._4_4_;
  auVar118._8_4_ = auVar93._8_4_ * auVar105._8_4_;
  auVar118._12_4_ = auVar93._12_4_ * auVar105._12_4_;
  auVar118._16_4_ = auVar105._16_4_ * 0.0;
  auVar118._20_4_ = auVar105._20_4_ * 0.0;
  auVar118._24_4_ = auVar105._24_4_ * 0.0;
  auVar118._28_4_ = 0;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar6 * 0x10 + uVar82 * -2 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar91));
  auVar110._4_4_ = auVar19._4_4_ * auVar105._4_4_;
  auVar110._0_4_ = auVar19._0_4_ * auVar105._0_4_;
  auVar110._8_4_ = auVar19._8_4_ * auVar105._8_4_;
  auVar110._12_4_ = auVar19._12_4_ * auVar105._12_4_;
  auVar110._16_4_ = auVar105._16_4_ * 0.0;
  auVar110._20_4_ = auVar105._20_4_ * 0.0;
  auVar110._24_4_ = auVar105._24_4_ * 0.0;
  auVar110._28_4_ = auVar105._28_4_;
  auVar105 = vcvtdq2ps_avx(auVar103);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar91));
  auVar117._0_4_ = auVar19._0_4_ * auVar105._0_4_;
  auVar117._4_4_ = auVar19._4_4_ * auVar105._4_4_;
  auVar117._8_4_ = auVar19._8_4_ * auVar105._8_4_;
  auVar117._12_4_ = auVar19._12_4_ * auVar105._12_4_;
  auVar117._16_4_ = auVar105._16_4_ * 0.0;
  auVar117._20_4_ = auVar105._20_4_ * 0.0;
  auVar117._24_4_ = auVar105._24_4_ * 0.0;
  auVar117._28_4_ = 0;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 + uVar82 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar5));
  auVar111._4_4_ = auVar105._4_4_ * auVar94._4_4_;
  auVar111._0_4_ = auVar105._0_4_ * auVar94._0_4_;
  auVar111._8_4_ = auVar105._8_4_ * auVar94._8_4_;
  auVar111._12_4_ = auVar105._12_4_ * auVar94._12_4_;
  auVar111._16_4_ = auVar105._16_4_ * 0.0;
  auVar111._20_4_ = auVar105._20_4_ * 0.0;
  auVar111._24_4_ = auVar105._24_4_ * 0.0;
  auVar111._28_4_ = auVar105._28_4_;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0x17 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar5));
  auVar116._0_4_ = auVar94._0_4_ * auVar105._0_4_;
  auVar116._4_4_ = auVar94._4_4_ * auVar105._4_4_;
  auVar116._8_4_ = auVar94._8_4_ * auVar105._8_4_;
  auVar116._12_4_ = auVar94._12_4_ * auVar105._12_4_;
  auVar116._16_4_ = auVar105._16_4_ * 0.0;
  auVar116._20_4_ = auVar105._20_4_ * 0.0;
  auVar116._24_4_ = auVar105._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar105 = vpminsd_avx2(auVar109,auVar118);
  auVar103 = vpminsd_avx2(auVar110,auVar117);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103 = vpminsd_avx2(auVar111,auVar116);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar106._4_4_ = uVar154;
  auVar106._0_4_ = uVar154;
  auVar106._8_4_ = uVar154;
  auVar106._12_4_ = uVar154;
  auVar106._16_4_ = uVar154;
  auVar106._20_4_ = uVar154;
  auVar106._24_4_ = uVar154;
  auVar106._28_4_ = uVar154;
  auVar103 = vmaxps_avx512vl(auVar103,auVar106);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  auVar103._16_4_ = 0x3f7ffffa;
  auVar103._20_4_ = 0x3f7ffffa;
  auVar103._24_4_ = 0x3f7ffffa;
  auVar103._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar105,auVar103);
  auVar105 = vpmaxsd_avx2(auVar109,auVar118);
  auVar103 = vpmaxsd_avx2(auVar110,auVar117);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar103 = vpmaxsd_avx2(auVar111,auVar116);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar107._4_4_ = uVar154;
  auVar107._0_4_ = uVar154;
  auVar107._8_4_ = uVar154;
  auVar107._12_4_ = uVar154;
  auVar107._16_4_ = uVar154;
  auVar107._20_4_ = uVar154;
  auVar107._24_4_ = uVar154;
  auVar107._28_4_ = uVar154;
  auVar103 = vminps_avx512vl(auVar103,auVar107);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar108._8_4_ = 0x3f800003;
  auVar108._0_8_ = 0x3f8000033f800003;
  auVar108._12_4_ = 0x3f800003;
  auVar108._16_4_ = 0x3f800003;
  auVar108._20_4_ = 0x3f800003;
  auVar108._24_4_ = 0x3f800003;
  auVar108._28_4_ = 0x3f800003;
  auVar105 = vmulps_avx512vl(auVar105,auVar108);
  uVar22 = vpcmpgtd_avx512vl(auVar104,_DAT_0205a920);
  uVar20 = vcmpps_avx512vl(local_420,auVar105,2);
  if ((byte)((byte)uVar20 & (byte)uVar22) == 0) {
    return;
  }
  local_908 = (ulong)(byte)((byte)uVar20 & (byte)uVar22);
  local_928 = (undefined1 (*) [32])&local_4c0;
  local_660 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_920 = prim;
LAB_01e0d7aa:
  lVar87 = 0;
  for (uVar89 = local_908; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
    lVar87 = lVar87 + 1;
  }
  uVar86 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar87 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar86].ptr;
  uVar89 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar7);
  p_Var10 = pGVar9[1].intersectionFilterN;
  lVar87 = *(long *)&pGVar9[1].time_range.upper;
  auVar93 = *(undefined1 (*) [16])(lVar87 + (long)p_Var10 * uVar89);
  auVar19 = *(undefined1 (*) [16])(lVar87 + (uVar89 + 1) * (long)p_Var10);
  auVar94 = *(undefined1 (*) [16])(lVar87 + (uVar89 + 2) * (long)p_Var10);
  local_908 = local_908 - 1 & local_908;
  auVar253 = *(undefined1 (*) [16])(lVar87 + (uVar89 + 3) * (long)p_Var10);
  if (local_908 != 0) {
    uVar85 = local_908 - 1 & local_908;
    for (uVar89 = local_908; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
    }
    if (uVar85 != 0) {
      for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar5 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_5c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_8e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar268 = ZEXT3264(local_8e0);
  auVar91 = vunpcklps_avx512vl(local_5c0._0_16_,local_8e0._0_16_);
  local_900 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar267 = ZEXT3264(local_900);
  auVar266 = local_900._0_16_;
  local_870 = vinsertps_avx512f(auVar91,auVar266,0x28);
  auVar248 = ZEXT1664(local_870);
  auVar96._0_4_ = auVar93._0_4_ + auVar19._0_4_ + auVar94._0_4_ + auVar253._0_4_;
  auVar96._4_4_ = auVar93._4_4_ + auVar19._4_4_ + auVar94._4_4_ + auVar253._4_4_;
  auVar96._8_4_ = auVar93._8_4_ + auVar19._8_4_ + auVar94._8_4_ + auVar253._8_4_;
  auVar96._12_4_ = auVar93._12_4_ + auVar19._12_4_ + auVar94._12_4_ + auVar253._12_4_;
  auVar97._8_4_ = 0x3e800000;
  auVar97._0_8_ = 0x3e8000003e800000;
  auVar97._12_4_ = 0x3e800000;
  auVar91 = vmulps_avx512vl(auVar96,auVar97);
  auVar91 = vsubps_avx(auVar91,auVar5);
  auVar91 = vdpps_avx(auVar91,local_870,0x7f);
  fVar217 = *(float *)(ray + k * 4 + 0x60);
  auVar254 = ZEXT464((uint)fVar217);
  local_880 = vdpps_avx(local_870,local_870,0x7f);
  auVar98._4_12_ = ZEXT812(0) << 0x20;
  auVar98._0_4_ = local_880._0_4_;
  auVar92 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar98);
  auVar95 = vfnmadd213ss_fma(auVar92,local_880,ZEXT416(0x40000000));
  local_400 = auVar91._0_4_ * auVar92._0_4_ * auVar95._0_4_;
  auVar238 = ZEXT464((uint)local_400);
  auVar99._4_4_ = local_400;
  auVar99._0_4_ = local_400;
  auVar99._8_4_ = local_400;
  auVar99._12_4_ = local_400;
  fStack_710 = local_400;
  _local_720 = auVar99;
  fStack_70c = local_400;
  fStack_708 = local_400;
  fStack_704 = local_400;
  auVar91 = vfmadd231ps_fma(auVar5,local_870,auVar99);
  auVar91 = vblendps_avx(auVar91,ZEXT816(0) << 0x40,8);
  auVar93 = vsubps_avx(auVar93,auVar91);
  auVar94 = vsubps_avx(auVar94,auVar91);
  auVar19 = vsubps_avx(auVar19,auVar91);
  auVar247 = ZEXT1664(auVar19);
  auVar253 = vsubps_avx(auVar253,auVar91);
  local_1e0 = auVar93._0_4_;
  fStack_1dc = local_1e0;
  fStack_1d8 = local_1e0;
  fStack_1d4 = local_1e0;
  fStack_1d0 = local_1e0;
  fStack_1cc = local_1e0;
  fStack_1c8 = local_1e0;
  fStack_1c4 = local_1e0;
  auVar125._8_4_ = 1;
  auVar125._0_8_ = 0x100000001;
  auVar125._12_4_ = 1;
  auVar125._16_4_ = 1;
  auVar125._20_4_ = 1;
  auVar125._24_4_ = 1;
  auVar125._28_4_ = 1;
  local_800 = ZEXT1632(auVar93);
  local_200 = vpermps_avx2(auVar125,local_800);
  auVar128._8_4_ = 2;
  auVar128._0_8_ = 0x200000002;
  auVar128._12_4_ = 2;
  auVar128._16_4_ = 2;
  auVar128._20_4_ = 2;
  auVar128._24_4_ = 2;
  auVar128._28_4_ = 2;
  local_220 = vpermps_avx2(auVar128,local_800);
  auVar129._8_4_ = 3;
  auVar129._0_8_ = 0x300000003;
  auVar129._12_4_ = 3;
  auVar129._16_4_ = 3;
  auVar129._20_4_ = 3;
  auVar129._24_4_ = 3;
  auVar129._28_4_ = 3;
  local_240 = vpermps_avx2(auVar129,local_800);
  local_260 = auVar19._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_840 = ZEXT1632(auVar19);
  local_280 = vpermps_avx2(auVar125,local_840);
  local_2a0 = vpermps_avx2(auVar128,local_840);
  local_2c0 = vpermps_avx2(auVar129,local_840);
  local_2e0 = auVar94._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_820 = ZEXT1632(auVar94);
  local_300 = vpermps_avx2(auVar125,local_820);
  local_320 = vpermps_avx2(auVar128,local_820);
  local_340 = vpermps_avx2(auVar129,local_820);
  local_360 = auVar253._0_4_;
  uStack_35c = local_360;
  uStack_358 = local_360;
  uStack_354 = local_360;
  uStack_350 = local_360;
  uStack_34c = local_360;
  uStack_348 = local_360;
  uStack_344 = local_360;
  _local_860 = ZEXT1632(auVar253);
  local_380 = vpermps_avx2(auVar125,_local_860);
  local_3a0 = vpermps_avx2(auVar128,_local_860);
  local_3c0 = vpermps_avx2(auVar129,_local_860);
  auVar93 = vmulss_avx512f(auVar266,auVar266);
  auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),local_8e0,local_8e0);
  local_5e0 = vfmadd231ps_avx512vl(auVar105,local_5c0,local_5c0);
  local_3e0._0_4_ = local_5e0._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  auVar124._8_4_ = 0x7fffffff;
  auVar124._0_8_ = 0x7fffffff7fffffff;
  auVar124._12_4_ = 0x7fffffff;
  auVar124._16_4_ = 0x7fffffff;
  auVar124._20_4_ = 0x7fffffff;
  auVar124._24_4_ = 0x7fffffff;
  auVar124._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_3e0,auVar124);
  local_7a0 = ZEXT416((uint)local_400);
  local_400 = fVar217 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_620 = vpbroadcastd_avx512vl();
  local_918 = 1;
  local_910 = 0;
  local_640 = vpbroadcastd_avx512vl();
  auVar93 = vsqrtss_avx(local_880,local_880);
  auVar19 = vsqrtss_avx(local_880,local_880);
  auVar212 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar265 = ZEXT3264(auVar105);
  do {
    local_940 = auVar212._0_16_;
    auVar94 = vmovshdup_avx(local_940);
    fVar152 = auVar212._0_4_;
    fVar257 = auVar94._0_4_ - fVar152;
    fVar197 = fVar257 * 0.04761905;
    auVar232._4_4_ = fVar152;
    auVar232._0_4_ = fVar152;
    auVar232._8_4_ = fVar152;
    auVar232._12_4_ = fVar152;
    auVar232._16_4_ = fVar152;
    auVar232._20_4_ = fVar152;
    auVar232._24_4_ = fVar152;
    auVar232._28_4_ = fVar152;
    local_8a0._4_4_ = fVar257;
    local_8a0._0_4_ = fVar257;
    local_8a0._8_4_ = fVar257;
    local_8a0._12_4_ = fVar257;
    local_8a0._16_4_ = fVar257;
    local_8a0._20_4_ = fVar257;
    local_8a0._24_4_ = fVar257;
    local_8a0._28_4_ = fVar257;
    auVar94 = vfmadd231ps_fma(auVar232,local_8a0,_DAT_02020f20);
    auVar103 = vsubps_avx512vl(auVar265._0_32_,ZEXT1632(auVar94));
    fVar152 = auVar103._0_4_;
    fVar241 = auVar103._4_4_;
    fVar249 = auVar103._8_4_;
    fVar251 = auVar103._12_4_;
    fVar243 = auVar103._16_4_;
    fVar237 = auVar103._20_4_;
    fVar252 = auVar103._24_4_;
    fVar153 = fVar152 * fVar152 * fVar152;
    fVar172 = fVar241 * fVar241 * fVar241;
    auVar38._4_4_ = fVar172;
    auVar38._0_4_ = fVar153;
    fVar173 = fVar249 * fVar249 * fVar249;
    auVar38._8_4_ = fVar173;
    fVar174 = fVar251 * fVar251 * fVar251;
    auVar38._12_4_ = fVar174;
    fVar175 = fVar243 * fVar243 * fVar243;
    auVar38._16_4_ = fVar175;
    fVar176 = fVar237 * fVar237 * fVar237;
    auVar38._20_4_ = fVar176;
    fVar177 = fVar252 * fVar252 * fVar252;
    auVar38._24_4_ = fVar177;
    auVar38._28_4_ = fVar257;
    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar105 = vmulps_avx512vl(auVar38,auVar104);
    fVar240 = auVar94._0_4_;
    fVar242 = auVar94._4_4_;
    fVar250 = auVar94._8_4_;
    fVar216 = auVar94._12_4_;
    fVar196 = fVar240 * fVar240 * fVar240;
    fVar213 = fVar242 * fVar242 * fVar242;
    fVar214 = fVar250 * fVar250 * fVar250;
    fVar215 = fVar216 * fVar216 * fVar216;
    auVar212._0_28_ = ZEXT1628(CONCAT412(fVar215,CONCAT48(fVar214,CONCAT44(fVar213,fVar196))));
    auVar265._0_4_ = fVar240 * fVar152;
    auVar265._4_4_ = fVar242 * fVar241;
    auVar265._8_4_ = fVar250 * fVar249;
    auVar265._12_4_ = fVar216 * fVar251;
    auVar265._16_4_ = fVar243 * 0.0;
    auVar265._20_4_ = fVar237 * 0.0;
    auVar265._28_36_ = auVar254._28_36_;
    auVar265._24_4_ = fVar252 * 0.0;
    auVar106 = vmulps_avx512vl(auVar212._0_32_,auVar104);
    fVar257 = auVar106._28_4_ + fVar257;
    auVar39._4_4_ = fVar172 * 0.16666667;
    auVar39._0_4_ = fVar153 * 0.16666667;
    auVar39._8_4_ = fVar173 * 0.16666667;
    auVar39._12_4_ = fVar174 * 0.16666667;
    auVar39._16_4_ = fVar175 * 0.16666667;
    auVar39._20_4_ = fVar176 * 0.16666667;
    auVar39._24_4_ = fVar177 * 0.16666667;
    auVar39._28_4_ = fVar257;
    auVar40._4_4_ =
         (auVar265._4_4_ * fVar241 * 12.0 + auVar265._4_4_ * fVar242 * 6.0 +
         fVar213 + auVar105._4_4_) * 0.16666667;
    auVar40._0_4_ =
         (auVar265._0_4_ * fVar152 * 12.0 + auVar265._0_4_ * fVar240 * 6.0 +
         fVar196 + auVar105._0_4_) * 0.16666667;
    auVar40._8_4_ =
         (auVar265._8_4_ * fVar249 * 12.0 + auVar265._8_4_ * fVar250 * 6.0 +
         fVar214 + auVar105._8_4_) * 0.16666667;
    auVar40._12_4_ =
         (auVar265._12_4_ * fVar251 * 12.0 + auVar265._12_4_ * fVar216 * 6.0 +
         fVar215 + auVar105._12_4_) * 0.16666667;
    auVar40._16_4_ =
         (auVar265._16_4_ * fVar243 * 12.0 + auVar265._16_4_ * 0.0 * 6.0 + auVar105._16_4_ + 0.0) *
         0.16666667;
    auVar40._20_4_ =
         (auVar265._20_4_ * fVar237 * 12.0 + auVar265._20_4_ * 0.0 * 6.0 + auVar105._20_4_ + 0.0) *
         0.16666667;
    auVar40._24_4_ =
         (auVar265._24_4_ * fVar252 * 12.0 + auVar265._24_4_ * 0.0 * 6.0 + auVar105._24_4_ + 0.0) *
         0.16666667;
    auVar40._28_4_ = auVar259._28_4_;
    auVar41._4_4_ =
         (auVar106._4_4_ + fVar172 +
         auVar265._4_4_ * fVar242 * 12.0 + auVar265._4_4_ * fVar241 * 6.0) * 0.16666667;
    auVar41._0_4_ =
         (auVar106._0_4_ + fVar153 +
         auVar265._0_4_ * fVar240 * 12.0 + auVar265._0_4_ * fVar152 * 6.0) * 0.16666667;
    auVar41._8_4_ =
         (auVar106._8_4_ + fVar173 +
         auVar265._8_4_ * fVar250 * 12.0 + auVar265._8_4_ * fVar249 * 6.0) * 0.16666667;
    auVar41._12_4_ =
         (auVar106._12_4_ + fVar174 +
         auVar265._12_4_ * fVar216 * 12.0 + auVar265._12_4_ * fVar251 * 6.0) * 0.16666667;
    auVar41._16_4_ =
         (auVar106._16_4_ + fVar175 + auVar265._16_4_ * 0.0 * 12.0 + auVar265._16_4_ * fVar243 * 6.0
         ) * 0.16666667;
    auVar41._20_4_ =
         (auVar106._20_4_ + fVar176 + auVar265._20_4_ * 0.0 * 12.0 + auVar265._20_4_ * fVar237 * 6.0
         ) * 0.16666667;
    auVar41._24_4_ =
         (auVar106._24_4_ + fVar177 + auVar265._24_4_ * 0.0 * 12.0 + auVar265._24_4_ * fVar252 * 6.0
         ) * 0.16666667;
    auVar41._28_4_ = auVar264._28_4_;
    auVar42._28_4_ = fVar257 + auVar259._28_4_ + auVar238._28_4_;
    auVar42._0_28_ =
         ZEXT1628(CONCAT412(fVar215 * 0.16666667,
                            CONCAT48(fVar214 * 0.16666667,
                                     CONCAT44(fVar213 * 0.16666667,fVar196 * 0.16666667))));
    auVar74._4_4_ = uStack_35c;
    auVar74._0_4_ = local_360;
    auVar74._8_4_ = uStack_358;
    auVar74._12_4_ = uStack_354;
    auVar74._16_4_ = uStack_350;
    auVar74._20_4_ = uStack_34c;
    auVar74._24_4_ = uStack_348;
    auVar74._28_4_ = uStack_344;
    auVar105 = vmulps_avx512vl(auVar74,auVar42);
    auVar106 = vmulps_avx512vl(local_380,auVar42);
    auVar107 = vmulps_avx512vl(local_3a0,auVar42);
    auVar108 = vmulps_avx512vl(local_3c0,auVar42);
    auVar75._4_4_ = uStack_2dc;
    auVar75._0_4_ = local_2e0;
    auVar75._8_4_ = uStack_2d8;
    auVar75._12_4_ = uStack_2d4;
    auVar75._16_4_ = uStack_2d0;
    auVar75._20_4_ = uStack_2cc;
    auVar75._24_4_ = uStack_2c8;
    auVar75._28_4_ = uStack_2c4;
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar41,auVar75);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar41,local_300);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar41,local_320);
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_340,auVar41);
    auVar76._4_4_ = uStack_25c;
    auVar76._0_4_ = local_260;
    auVar76._8_4_ = uStack_258;
    auVar76._12_4_ = uStack_254;
    auVar76._16_4_ = uStack_250;
    auVar76._20_4_ = uStack_24c;
    auVar76._24_4_ = uStack_248;
    auVar76._28_4_ = uStack_244;
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar40,auVar76);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar40,local_280);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar40,local_2a0);
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_2c0,auVar40);
    auVar77._4_4_ = fStack_1dc;
    auVar77._0_4_ = local_1e0;
    auVar77._8_4_ = fStack_1d8;
    auVar77._12_4_ = fStack_1d4;
    auVar77._16_4_ = fStack_1d0;
    auVar77._20_4_ = fStack_1cc;
    auVar77._24_4_ = fStack_1c8;
    auVar77._28_4_ = fStack_1c4;
    auVar253 = vfmadd231ps_fma(auVar105,auVar39,auVar77);
    auVar91 = vfmadd231ps_fma(auVar106,auVar39,local_200);
    auVar5 = vfmadd231ps_fma(auVar107,auVar39,local_220);
    auVar95 = vfmadd231ps_fma(auVar108,local_240,auVar39);
    auVar105 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar106 = vxorps_avx512vl(auVar103,auVar105);
    auVar107 = vxorps_avx512vl(ZEXT1632(auVar94),auVar105);
    auVar233._0_4_ = auVar107._0_4_ * fVar240;
    auVar233._4_4_ = auVar107._4_4_ * fVar242;
    auVar233._8_4_ = auVar107._8_4_ * fVar250;
    auVar233._12_4_ = auVar107._12_4_ * fVar216;
    auVar233._16_4_ = auVar107._16_4_ * 0.0;
    auVar233._20_4_ = auVar107._20_4_ * 0.0;
    auVar233._24_4_ = auVar107._24_4_ * 0.0;
    auVar233._28_4_ = 0;
    auVar108 = vmulps_avx512vl(auVar265._0_32_,auVar104);
    auVar105 = vsubps_avx(auVar233,auVar108);
    auVar43._4_4_ = auVar106._4_4_ * fVar241 * 0.5;
    auVar43._0_4_ = auVar106._0_4_ * fVar152 * 0.5;
    auVar43._8_4_ = auVar106._8_4_ * fVar249 * 0.5;
    auVar43._12_4_ = auVar106._12_4_ * fVar251 * 0.5;
    auVar43._16_4_ = auVar106._16_4_ * fVar243 * 0.5;
    auVar43._20_4_ = auVar106._20_4_ * fVar237 * 0.5;
    auVar43._24_4_ = auVar106._24_4_ * fVar252 * 0.5;
    auVar43._28_4_ = auVar103._28_4_;
    auVar44._4_4_ = auVar105._4_4_ * 0.5;
    auVar44._0_4_ = auVar105._0_4_ * 0.5;
    auVar44._8_4_ = auVar105._8_4_ * 0.5;
    auVar44._12_4_ = auVar105._12_4_ * 0.5;
    auVar44._16_4_ = auVar105._16_4_ * 0.5;
    auVar44._20_4_ = auVar105._20_4_ * 0.5;
    auVar44._24_4_ = auVar105._24_4_ * 0.5;
    auVar44._28_4_ = auVar105._28_4_;
    auVar45._4_4_ = (fVar241 * fVar241 + auVar108._4_4_) * 0.5;
    auVar45._0_4_ = (fVar152 * fVar152 + auVar108._0_4_) * 0.5;
    auVar45._8_4_ = (fVar249 * fVar249 + auVar108._8_4_) * 0.5;
    auVar45._12_4_ = (fVar251 * fVar251 + auVar108._12_4_) * 0.5;
    auVar45._16_4_ = (fVar243 * fVar243 + auVar108._16_4_) * 0.5;
    auVar45._20_4_ = (fVar237 * fVar237 + auVar108._20_4_) * 0.5;
    auVar45._24_4_ = (fVar252 * fVar252 + auVar108._24_4_) * 0.5;
    auVar45._28_4_ = auVar247._28_4_ + auVar108._28_4_;
    auVar46._28_4_ = auVar248._28_4_;
    auVar46._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * fVar216 * 0.5,
                            CONCAT48(fVar250 * fVar250 * 0.5,
                                     CONCAT44(fVar242 * fVar242 * 0.5,fVar240 * fVar240 * 0.5))));
    auVar105 = vmulps_avx512vl(auVar74,auVar46);
    auVar103 = vmulps_avx512vl(local_380,auVar46);
    auVar106 = vmulps_avx512vl(local_3a0,auVar46);
    auVar108 = vmulps_avx512vl(local_3c0,auVar46);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar45,auVar75);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar45,local_300);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar45,local_320);
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_340,auVar45);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar44,auVar76);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar44,local_280);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar44,local_2a0);
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_2c0,auVar44);
    auVar94 = vfmadd231ps_fma(auVar105,auVar43,auVar77);
    auVar92 = vfmadd231ps_fma(auVar103,auVar43,local_200);
    auVar266 = vfmadd231ps_fma(auVar106,auVar43,local_220);
    auVar97 = vfmadd231ps_fma(auVar108,local_240,auVar43);
    auVar47._4_4_ = auVar94._4_4_ * fVar197;
    auVar47._0_4_ = auVar94._0_4_ * fVar197;
    auVar47._8_4_ = auVar94._8_4_ * fVar197;
    auVar47._12_4_ = auVar94._12_4_ * fVar197;
    auVar47._16_4_ = fVar197 * 0.0;
    auVar47._20_4_ = fVar197 * 0.0;
    auVar47._24_4_ = fVar197 * 0.0;
    auVar47._28_4_ = auVar107._28_4_;
    auVar258._0_4_ = auVar92._0_4_ * fVar197;
    auVar258._4_4_ = auVar92._4_4_ * fVar197;
    auVar258._8_4_ = auVar92._8_4_ * fVar197;
    auVar258._12_4_ = auVar92._12_4_ * fVar197;
    auVar258._16_4_ = fVar197 * 0.0;
    auVar258._20_4_ = fVar197 * 0.0;
    auVar258._24_4_ = fVar197 * 0.0;
    auVar258._28_4_ = 0;
    auVar259 = ZEXT3264(auVar258);
    auVar262._0_4_ = auVar266._0_4_ * fVar197;
    auVar262._4_4_ = auVar266._4_4_ * fVar197;
    auVar262._8_4_ = auVar266._8_4_ * fVar197;
    auVar262._12_4_ = auVar266._12_4_ * fVar197;
    auVar262._16_4_ = fVar197 * 0.0;
    auVar262._20_4_ = fVar197 * 0.0;
    auVar262._24_4_ = fVar197 * 0.0;
    auVar262._28_4_ = 0;
    auVar264 = ZEXT3264(auVar262);
    fVar152 = auVar97._0_4_ * fVar197;
    fVar240 = auVar97._4_4_ * fVar197;
    auVar48._4_4_ = fVar240;
    auVar48._0_4_ = fVar152;
    fVar241 = auVar97._8_4_ * fVar197;
    auVar48._8_4_ = fVar241;
    fVar242 = auVar97._12_4_ * fVar197;
    auVar48._12_4_ = fVar242;
    auVar48._16_4_ = fVar197 * 0.0;
    auVar48._20_4_ = fVar197 * 0.0;
    auVar48._24_4_ = fVar197 * 0.0;
    auVar48._28_4_ = fStack_1c4;
    auVar94 = vxorps_avx512vl(auVar268._0_16_,auVar268._0_16_);
    auVar109 = vpermt2ps_avx512vl(ZEXT1632(auVar253),_DAT_0205fd20,ZEXT1632(auVar94));
    auVar247 = ZEXT3264(auVar109);
    auVar110 = vpermt2ps_avx512vl(ZEXT1632(auVar91),_DAT_0205fd20,ZEXT1632(auVar94));
    auVar248 = ZEXT3264(auVar110);
    auVar106 = ZEXT1632(auVar94);
    auVar111 = vpermt2ps_avx512vl(ZEXT1632(auVar5),_DAT_0205fd20,auVar106);
    auVar254 = ZEXT3264(auVar111);
    auVar234._0_4_ = fVar152 + auVar95._0_4_;
    auVar234._4_4_ = fVar240 + auVar95._4_4_;
    auVar234._8_4_ = fVar241 + auVar95._8_4_;
    auVar234._12_4_ = fVar242 + auVar95._12_4_;
    auVar234._16_4_ = fVar197 * 0.0 + 0.0;
    auVar234._20_4_ = fVar197 * 0.0 + 0.0;
    auVar234._24_4_ = fVar197 * 0.0 + 0.0;
    auVar234._28_4_ = fStack_1c4 + 0.0;
    auVar105 = vmaxps_avx(ZEXT1632(auVar95),auVar234);
    auVar103 = vminps_avx(ZEXT1632(auVar95),auVar234);
    auVar112 = vpermt2ps_avx512vl(ZEXT1632(auVar95),_DAT_0205fd20,auVar106);
    auVar102 = vpermt2ps_avx512vl(auVar47,_DAT_0205fd20,auVar106);
    auVar113 = vpermt2ps_avx512vl(auVar258,_DAT_0205fd20,auVar106);
    auVar124 = ZEXT1632(auVar94);
    auVar114 = vpermt2ps_avx512vl(auVar262,_DAT_0205fd20,auVar124);
    auVar238 = ZEXT3264(auVar114);
    auVar106 = vpermt2ps_avx512vl(auVar48,_DAT_0205fd20,auVar124);
    auVar100 = vsubps_avx512vl(auVar112,auVar106);
    auVar106 = vsubps_avx(auVar109,ZEXT1632(auVar253));
    auVar107 = vsubps_avx(auVar110,ZEXT1632(auVar91));
    local_700 = vsubps_avx512vl(auVar111,ZEXT1632(auVar5));
    auVar108 = vmulps_avx512vl(auVar107,auVar262);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar258,local_700);
    auVar101 = vmulps_avx512vl(local_700,auVar47);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar262,auVar106);
    auVar115 = vmulps_avx512vl(auVar106,auVar258);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar47,auVar107);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar101 = vfmadd231ps_avx512vl(auVar115,auVar101,auVar101);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,auVar108);
    auVar108 = vmulps_avx512vl(local_700,local_700);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar115 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar106);
    auVar116 = vrcp14ps_avx512vl(auVar115);
    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar117 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar108);
    auVar116 = vfmadd132ps_avx512vl(auVar117,auVar116,auVar116);
    auVar101 = vmulps_avx512vl(auVar101,auVar116);
    auVar117 = vmulps_avx512vl(auVar107,auVar114);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar113,local_700);
    auVar118 = vmulps_avx512vl(local_700,auVar102);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar114,auVar106);
    auVar119 = vmulps_avx512vl(auVar106,auVar113);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar102,auVar107);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vmulps_avx512vl(auVar117,auVar116);
    auVar101 = vmaxps_avx512vl(auVar101,auVar116);
    auVar101 = vsqrtps_avx512vl(auVar101);
    auVar116 = vmaxps_avx512vl(auVar100,auVar112);
    auVar105 = vmaxps_avx512vl(auVar105,auVar116);
    auVar116 = vaddps_avx512vl(auVar101,auVar105);
    auVar105 = vminps_avx512vl(auVar100,auVar112);
    auVar105 = vminps_avx(auVar103,auVar105);
    auVar105 = vsubps_avx512vl(auVar105,auVar101);
    auVar130._8_4_ = 0x3f800002;
    auVar130._0_8_ = 0x3f8000023f800002;
    auVar130._12_4_ = 0x3f800002;
    auVar130._16_4_ = 0x3f800002;
    auVar130._20_4_ = 0x3f800002;
    auVar130._24_4_ = 0x3f800002;
    auVar130._28_4_ = 0x3f800002;
    auVar103 = vmulps_avx512vl(auVar116,auVar130);
    auVar131._8_4_ = 0x3f7ffffc;
    auVar131._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar131._12_4_ = 0x3f7ffffc;
    auVar131._16_4_ = 0x3f7ffffc;
    auVar131._20_4_ = 0x3f7ffffc;
    auVar131._24_4_ = 0x3f7ffffc;
    auVar131._28_4_ = 0x3f7ffffc;
    auVar112 = vmulps_avx512vl(auVar105,auVar131);
    auVar49._4_4_ = auVar103._4_4_ * auVar103._4_4_;
    auVar49._0_4_ = auVar103._0_4_ * auVar103._0_4_;
    auVar49._8_4_ = auVar103._8_4_ * auVar103._8_4_;
    auVar49._12_4_ = auVar103._12_4_ * auVar103._12_4_;
    auVar49._16_4_ = auVar103._16_4_ * auVar103._16_4_;
    auVar49._20_4_ = auVar103._20_4_ * auVar103._20_4_;
    auVar49._24_4_ = auVar103._24_4_ * auVar103._24_4_;
    auVar49._28_4_ = auVar112._28_4_;
    auVar105 = vrsqrt14ps_avx512vl(auVar115);
    auVar25._8_4_ = 0xbf000000;
    auVar25._0_8_ = 0xbf000000bf000000;
    auVar25._12_4_ = 0xbf000000;
    auVar25._16_4_ = 0xbf000000;
    auVar25._20_4_ = 0xbf000000;
    auVar25._24_4_ = 0xbf000000;
    auVar25._28_4_ = 0xbf000000;
    auVar103 = vmulps_avx512vl(auVar115,auVar25);
    auVar50._4_4_ = auVar105._4_4_ * auVar103._4_4_;
    auVar50._0_4_ = auVar105._0_4_ * auVar103._0_4_;
    auVar50._8_4_ = auVar105._8_4_ * auVar103._8_4_;
    auVar50._12_4_ = auVar105._12_4_ * auVar103._12_4_;
    auVar50._16_4_ = auVar105._16_4_ * auVar103._16_4_;
    auVar50._20_4_ = auVar105._20_4_ * auVar103._20_4_;
    auVar50._24_4_ = auVar105._24_4_ * auVar103._24_4_;
    auVar50._28_4_ = auVar103._28_4_;
    auVar103 = vmulps_avx512vl(auVar105,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar50);
    auVar26._8_4_ = 0x3fc00000;
    auVar26._0_8_ = 0x3fc000003fc00000;
    auVar26._12_4_ = 0x3fc00000;
    auVar26._16_4_ = 0x3fc00000;
    auVar26._20_4_ = 0x3fc00000;
    auVar26._24_4_ = 0x3fc00000;
    auVar26._28_4_ = 0x3fc00000;
    auVar100 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar26);
    auVar51._4_4_ = auVar100._4_4_ * auVar106._4_4_;
    auVar51._0_4_ = auVar100._0_4_ * auVar106._0_4_;
    auVar51._8_4_ = auVar100._8_4_ * auVar106._8_4_;
    auVar51._12_4_ = auVar100._12_4_ * auVar106._12_4_;
    auVar51._16_4_ = auVar100._16_4_ * auVar106._16_4_;
    auVar51._20_4_ = auVar100._20_4_ * auVar106._20_4_;
    auVar51._24_4_ = auVar100._24_4_ * auVar106._24_4_;
    auVar51._28_4_ = auVar105._28_4_;
    auVar105 = vmulps_avx512vl(auVar107,auVar100);
    auVar103 = vmulps_avx512vl(local_700,auVar100);
    local_960 = ZEXT1632(auVar253);
    auVar101 = vsubps_avx512vl(auVar124,local_960);
    auVar208 = ZEXT1632(auVar91);
    auVar115 = vsubps_avx512vl(auVar124,auVar208);
    local_8c0 = ZEXT1632(auVar5);
    auVar116 = vsubps_avx512vl(auVar124,local_8c0);
    auVar117 = vmulps_avx512vl(auVar267._0_32_,auVar116);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar268._0_32_,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,local_5c0,auVar101);
    auVar118 = vmulps_avx512vl(auVar116,auVar116);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar115,auVar115);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar101,auVar101);
    auVar119 = vmulps_avx512vl(auVar267._0_32_,auVar103);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar105,auVar268._0_32_);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar51,local_5c0);
    auVar103 = vmulps_avx512vl(auVar116,auVar103);
    auVar105 = vfmadd231ps_avx512vl(auVar103,auVar115,auVar105);
    auVar120 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar51);
    auVar121 = vmulps_avx512vl(auVar119,auVar119);
    auVar105 = vsubps_avx(local_3e0,auVar121);
    auVar103 = vmulps_avx512vl(auVar119,auVar120);
    auVar103 = vsubps_avx512vl(auVar117,auVar103);
    auVar117 = vaddps_avx512vl(auVar103,auVar103);
    auVar103 = vmulps_avx512vl(auVar120,auVar120);
    auVar118 = vsubps_avx512vl(auVar118,auVar103);
    auVar103 = vsubps_avx(auVar118,auVar49);
    auVar122 = vmulps_avx512vl(auVar117,auVar117);
    auVar104 = vmulps_avx512vl(auVar105,auVar104);
    auVar123 = vmulps_avx512vl(auVar104,auVar103);
    auVar123 = vsubps_avx512vl(auVar122,auVar123);
    uVar89 = vcmpps_avx512vl(auVar123,auVar124,5);
    bVar78 = (byte)uVar89;
    if (bVar78 == 0) {
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar123 = vsqrtps_avx512vl(auVar123);
      auVar124 = vaddps_avx512vl(auVar105,auVar105);
      auVar125 = vrcp14ps_avx512vl(auVar124);
      auVar108 = vfnmadd213ps_avx512vl(auVar124,auVar125,auVar108);
      auVar108 = vfmadd132ps_avx512vl(auVar108,auVar125,auVar125);
      auVar27._8_4_ = 0x80000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar27._12_4_ = 0x80000000;
      auVar27._16_4_ = 0x80000000;
      auVar27._20_4_ = 0x80000000;
      auVar27._24_4_ = 0x80000000;
      auVar27._28_4_ = 0x80000000;
      auVar124 = vxorps_avx512vl(auVar117,auVar27);
      auVar124 = vsubps_avx512vl(auVar124,auVar123);
      auVar124 = vmulps_avx512vl(auVar124,auVar108);
      auVar123 = vsubps_avx512vl(auVar123,auVar117);
      auVar108 = vmulps_avx512vl(auVar123,auVar108);
      auVar123 = vfmadd213ps_avx512vl(auVar119,auVar124,auVar120);
      local_680 = vmulps_avx512vl(auVar100,auVar123);
      auVar123 = vfmadd213ps_avx512vl(auVar119,auVar108,auVar120);
      local_6a0 = vmulps_avx512vl(auVar100,auVar123);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123 = vblendmps_avx512vl(auVar123,auVar124);
      auVar126._0_4_ =
           (uint)(bVar78 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar78 & 1) * local_6a0._0_4_;
      bVar12 = (bool)((byte)(uVar89 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar12 * auVar123._4_4_ | (uint)!bVar12 * local_6a0._4_4_;
      bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar12 * auVar123._8_4_ | (uint)!bVar12 * local_6a0._8_4_;
      bVar12 = (bool)((byte)(uVar89 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar12 * auVar123._12_4_ | (uint)!bVar12 * local_6a0._12_4_;
      bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar12 * auVar123._16_4_ | (uint)!bVar12 * local_6a0._16_4_;
      bVar12 = (bool)((byte)(uVar89 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar12 * auVar123._20_4_ | (uint)!bVar12 * local_6a0._20_4_;
      bVar12 = (bool)((byte)(uVar89 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar12 * auVar123._24_4_ | (uint)!bVar12 * local_6a0._24_4_;
      bVar12 = SUB81(uVar89 >> 7,0);
      auVar126._28_4_ = (uint)bVar12 * auVar123._28_4_ | (uint)!bVar12 * local_6a0._28_4_;
      auVar222._8_4_ = 0xff800000;
      auVar222._0_8_ = 0xff800000ff800000;
      auVar222._12_4_ = 0xff800000;
      auVar222._16_4_ = 0xff800000;
      auVar222._20_4_ = 0xff800000;
      auVar222._24_4_ = 0xff800000;
      auVar222._28_4_ = 0xff800000;
      auVar123 = vblendmps_avx512vl(auVar222,auVar108);
      auVar127._0_4_ =
           (uint)(bVar78 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar108._0_4_;
      bVar12 = (bool)((byte)(uVar89 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar12 * auVar123._4_4_ | (uint)!bVar12 * auVar108._4_4_;
      bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar12 * auVar123._8_4_ | (uint)!bVar12 * auVar108._8_4_;
      bVar12 = (bool)((byte)(uVar89 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar12 * auVar123._12_4_ | (uint)!bVar12 * auVar108._12_4_;
      bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar12 * auVar123._16_4_ | (uint)!bVar12 * auVar108._16_4_;
      bVar12 = (bool)((byte)(uVar89 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar12 * auVar123._20_4_ | (uint)!bVar12 * auVar108._20_4_;
      bVar12 = (bool)((byte)(uVar89 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar12 * auVar123._24_4_ | (uint)!bVar12 * auVar108._24_4_;
      bVar12 = SUB81(uVar89 >> 7,0);
      auVar127._28_4_ = (uint)bVar12 * auVar123._28_4_ | (uint)!bVar12 * auVar108._28_4_;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar121,auVar108);
      auVar123 = vmaxps_avx512vl(local_5e0,auVar108);
      auVar28._8_4_ = 0x36000000;
      auVar28._0_8_ = 0x3600000036000000;
      auVar28._12_4_ = 0x36000000;
      auVar28._16_4_ = 0x36000000;
      auVar28._20_4_ = 0x36000000;
      auVar28._24_4_ = 0x36000000;
      auVar28._28_4_ = 0x36000000;
      auVar123 = vmulps_avx512vl(auVar123,auVar28);
      vandps_avx512vl(auVar105,auVar108);
      uVar85 = vcmpps_avx512vl(auVar123,auVar123,1);
      uVar89 = uVar89 & uVar85;
      bVar84 = (byte)uVar89;
      if (bVar84 != 0) {
        uVar85 = vcmpps_avx512vl(auVar103,_DAT_02020f00,2);
        auVar236._8_4_ = 0xff800000;
        auVar236._0_8_ = 0xff800000ff800000;
        auVar236._12_4_ = 0xff800000;
        auVar236._16_4_ = 0xff800000;
        auVar236._20_4_ = 0xff800000;
        auVar236._24_4_ = 0xff800000;
        auVar236._28_4_ = 0xff800000;
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar108 = vblendmps_avx512vl(auVar103,auVar236);
        bVar81 = (byte)uVar85;
        uVar90 = (uint)(bVar81 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar123._0_4_;
        bVar12 = (bool)((byte)(uVar85 >> 1) & 1);
        uVar145 = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar123._4_4_;
        bVar12 = (bool)((byte)(uVar85 >> 2) & 1);
        uVar146 = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar123._8_4_;
        bVar12 = (bool)((byte)(uVar85 >> 3) & 1);
        uVar147 = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar123._12_4_;
        bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
        uVar148 = (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * auVar123._16_4_;
        bVar12 = (bool)((byte)(uVar85 >> 5) & 1);
        uVar149 = (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * auVar123._20_4_;
        bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
        uVar150 = (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * auVar123._24_4_;
        bVar12 = SUB81(uVar85 >> 7,0);
        uVar151 = (uint)bVar12 * auVar108._28_4_ | (uint)!bVar12 * auVar123._28_4_;
        auVar126._0_4_ = (bVar84 & 1) * uVar90 | !(bool)(bVar84 & 1) * auVar126._0_4_;
        bVar12 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar126._4_4_ = bVar12 * uVar145 | !bVar12 * auVar126._4_4_;
        bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar126._8_4_ = bVar12 * uVar146 | !bVar12 * auVar126._8_4_;
        bVar12 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar126._12_4_ = bVar12 * uVar147 | !bVar12 * auVar126._12_4_;
        bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar126._16_4_ = bVar12 * uVar148 | !bVar12 * auVar126._16_4_;
        bVar12 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar126._20_4_ = bVar12 * uVar149 | !bVar12 * auVar126._20_4_;
        bVar12 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar126._24_4_ = bVar12 * uVar150 | !bVar12 * auVar126._24_4_;
        bVar12 = SUB81(uVar89 >> 7,0);
        auVar126._28_4_ = bVar12 * uVar151 | !bVar12 * auVar126._28_4_;
        auVar103 = vblendmps_avx512vl(auVar236,auVar103);
        bVar12 = (bool)((byte)(uVar85 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar85 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar85 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar85 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar85 >> 6) & 1);
        bVar18 = SUB81(uVar85 >> 7,0);
        auVar127._0_4_ =
             (uint)(bVar84 & 1) *
             ((uint)(bVar81 & 1) * auVar103._0_4_ | !(bool)(bVar81 & 1) * uVar90) |
             !(bool)(bVar84 & 1) * auVar127._0_4_;
        bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar127._4_4_ =
             (uint)bVar88 * ((uint)bVar12 * auVar103._4_4_ | !bVar12 * uVar145) |
             !bVar88 * auVar127._4_4_;
        bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar127._8_4_ =
             (uint)bVar12 * ((uint)bVar13 * auVar103._8_4_ | !bVar13 * uVar146) |
             !bVar12 * auVar127._8_4_;
        bVar12 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar127._12_4_ =
             (uint)bVar12 * ((uint)bVar14 * auVar103._12_4_ | !bVar14 * uVar147) |
             !bVar12 * auVar127._12_4_;
        bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar127._16_4_ =
             (uint)bVar12 * ((uint)bVar15 * auVar103._16_4_ | !bVar15 * uVar148) |
             !bVar12 * auVar127._16_4_;
        bVar12 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar127._20_4_ =
             (uint)bVar12 * ((uint)bVar16 * auVar103._20_4_ | !bVar16 * uVar149) |
             !bVar12 * auVar127._20_4_;
        bVar12 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar127._24_4_ =
             (uint)bVar12 * ((uint)bVar17 * auVar103._24_4_ | !bVar17 * uVar150) |
             !bVar12 * auVar127._24_4_;
        bVar12 = SUB81(uVar89 >> 7,0);
        auVar127._28_4_ =
             (uint)bVar12 * ((uint)bVar18 * auVar103._28_4_ | !bVar18 * uVar151) |
             !bVar12 * auVar127._28_4_;
        bVar78 = (~bVar84 | bVar81) & bVar78;
      }
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar265 = ZEXT3264(auVar108);
    if ((bVar78 & 0x7f) == 0) {
      auVar268 = ZEXT3264(local_8e0);
      auVar267 = ZEXT3264(local_900);
    }
    else {
      fVar152 = *(float *)(ray + k * 4 + 0x100) - (float)local_7a0._0_4_;
      auVar223._4_4_ = fVar152;
      auVar223._0_4_ = fVar152;
      auVar223._8_4_ = fVar152;
      auVar223._12_4_ = fVar152;
      auVar223._16_4_ = fVar152;
      auVar223._20_4_ = fVar152;
      auVar223._24_4_ = fVar152;
      auVar223._28_4_ = fVar152;
      auVar123 = vminps_avx512vl(auVar223,auVar127);
      auVar73._4_4_ = fStack_3fc;
      auVar73._0_4_ = local_400;
      auVar73._8_4_ = fStack_3f8;
      auVar73._12_4_ = fStack_3f4;
      auVar73._16_4_ = fStack_3f0;
      auVar73._20_4_ = fStack_3ec;
      auVar73._24_4_ = fStack_3e8;
      auVar73._28_4_ = fStack_3e4;
      auVar103 = vmaxps_avx512vl(auVar73,auVar126);
      auVar116 = vmulps_avx512vl(auVar262,auVar116);
      auVar115 = vfmadd213ps_avx512vl(auVar115,auVar258,auVar116);
      auVar101 = vfmadd213ps_avx512vl(auVar101,auVar47,auVar115);
      auVar267 = ZEXT3264(local_900);
      auVar115 = vmulps_avx512vl(local_900,auVar262);
      auVar268 = ZEXT3264(local_8e0);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_8e0,auVar258);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_5c0,auVar47);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar115,auVar116);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar20 = vcmpps_avx512vl(auVar116,auVar124,1);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar101 = vxorps_avx512vl(auVar101,auVar125);
      auVar128 = vrcp14ps_avx512vl(auVar115);
      auVar129 = vxorps_avx512vl(auVar115,auVar125);
      auVar130 = vfnmadd213ps_avx512vl(auVar128,auVar115,auVar108);
      auVar130 = vfmadd132ps_avx512vl(auVar130,auVar128,auVar128);
      auVar101 = vmulps_avx512vl(auVar130,auVar101);
      uVar22 = vcmpps_avx512vl(auVar115,auVar129,1);
      bVar84 = (byte)uVar20 | (byte)uVar22;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar131 = vblendmps_avx512vl(auVar101,auVar130);
      auVar132._0_4_ =
           (uint)(bVar84 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar128._0_4_;
      bVar12 = (bool)(bVar84 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar12 * auVar131._4_4_ | (uint)!bVar12 * auVar128._4_4_;
      bVar12 = (bool)(bVar84 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar12 * auVar131._8_4_ | (uint)!bVar12 * auVar128._8_4_;
      bVar12 = (bool)(bVar84 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar12 * auVar131._12_4_ | (uint)!bVar12 * auVar128._12_4_;
      bVar12 = (bool)(bVar84 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar12 * auVar131._16_4_ | (uint)!bVar12 * auVar128._16_4_;
      bVar12 = (bool)(bVar84 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar12 * auVar131._20_4_ | (uint)!bVar12 * auVar128._20_4_;
      bVar12 = (bool)(bVar84 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar12 * auVar131._24_4_ | (uint)!bVar12 * auVar128._24_4_;
      auVar132._28_4_ =
           (uint)(bVar84 >> 7) * auVar131._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar128._28_4_;
      auVar103 = vmaxps_avx(auVar103,auVar132);
      uVar22 = vcmpps_avx512vl(auVar115,auVar129,6);
      bVar84 = (byte)uVar20 | (byte)uVar22;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar133._0_4_ =
           (uint)(bVar84 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar101._0_4_;
      bVar12 = (bool)(bVar84 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * auVar101._4_4_;
      bVar12 = (bool)(bVar84 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * auVar101._8_4_;
      bVar12 = (bool)(bVar84 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * auVar101._12_4_;
      bVar12 = (bool)(bVar84 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar12 * auVar115._16_4_ | (uint)!bVar12 * auVar101._16_4_;
      bVar12 = (bool)(bVar84 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar12 * auVar115._20_4_ | (uint)!bVar12 * auVar101._20_4_;
      bVar12 = (bool)(bVar84 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar12 * auVar115._24_4_ | (uint)!bVar12 * auVar101._24_4_;
      auVar133._28_4_ =
           (uint)(bVar84 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar101._28_4_;
      auVar101 = vminps_avx(auVar123,auVar133);
      auVar264 = ZEXT864(0) << 0x20;
      auVar109 = vsubps_avx(ZEXT832(0) << 0x20,auVar109);
      auVar110 = vsubps_avx(ZEXT832(0) << 0x20,auVar110);
      auVar123 = ZEXT832(0) << 0x20;
      auVar111 = vsubps_avx(auVar123,auVar111);
      auVar52._4_4_ = auVar111._4_4_ * auVar114._4_4_;
      auVar52._0_4_ = auVar111._0_4_ * auVar114._0_4_;
      auVar52._8_4_ = auVar111._8_4_ * auVar114._8_4_;
      auVar52._12_4_ = auVar111._12_4_ * auVar114._12_4_;
      auVar52._16_4_ = auVar111._16_4_ * auVar114._16_4_;
      auVar52._20_4_ = auVar111._20_4_ * auVar114._20_4_;
      auVar52._24_4_ = auVar111._24_4_ * auVar114._24_4_;
      auVar52._28_4_ = auVar111._28_4_;
      auVar110 = vfnmsub231ps_avx512vl(auVar52,auVar113,auVar110);
      auVar109 = vfnmadd231ps_avx512vl(auVar110,auVar102,auVar109);
      auVar110 = vmulps_avx512vl(local_900,auVar114);
      auVar110 = vfnmsub231ps_avx512vl(auVar110,local_8e0,auVar113);
      auVar110 = vfnmadd231ps_avx512vl(auVar110,local_5c0,auVar102);
      vandps_avx512vl(auVar110,auVar116);
      uVar20 = vcmpps_avx512vl(auVar110,auVar124,1);
      auVar109 = vxorps_avx512vl(auVar109,auVar125);
      auVar111 = vrcp14ps_avx512vl(auVar110);
      auVar102 = vxorps_avx512vl(auVar110,auVar125);
      auVar114 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar108);
      auVar94 = vfmadd132ps_fma(auVar114,auVar111,auVar111);
      auVar259 = ZEXT1664(auVar94);
      fVar152 = auVar94._0_4_ * auVar109._0_4_;
      fVar240 = auVar94._4_4_ * auVar109._4_4_;
      auVar53._4_4_ = fVar240;
      auVar53._0_4_ = fVar152;
      fVar241 = auVar94._8_4_ * auVar109._8_4_;
      auVar53._8_4_ = fVar241;
      fVar242 = auVar94._12_4_ * auVar109._12_4_;
      auVar53._12_4_ = fVar242;
      fVar249 = auVar109._16_4_ * 0.0;
      auVar53._16_4_ = fVar249;
      fVar250 = auVar109._20_4_ * 0.0;
      auVar53._20_4_ = fVar250;
      fVar251 = auVar109._24_4_ * 0.0;
      auVar53._24_4_ = fVar251;
      auVar53._28_4_ = auVar109._28_4_;
      uVar22 = vcmpps_avx512vl(auVar110,auVar102,1);
      bVar84 = (byte)uVar20 | (byte)uVar22;
      auVar114 = vblendmps_avx512vl(auVar53,auVar130);
      auVar134._0_4_ =
           (uint)(bVar84 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar111._0_4_;
      bVar12 = (bool)(bVar84 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar111._4_4_;
      bVar12 = (bool)(bVar84 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar111._8_4_;
      bVar12 = (bool)(bVar84 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar111._12_4_;
      bVar12 = (bool)(bVar84 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar12 * auVar114._16_4_ | (uint)!bVar12 * auVar111._16_4_;
      bVar12 = (bool)(bVar84 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar12 * auVar114._20_4_ | (uint)!bVar12 * auVar111._20_4_;
      bVar12 = (bool)(bVar84 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar12 * auVar114._24_4_ | (uint)!bVar12 * auVar111._24_4_;
      auVar134._28_4_ =
           (uint)(bVar84 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar111._28_4_;
      auVar254 = ZEXT3264(auVar134);
      _local_740 = vmaxps_avx(auVar103,auVar134);
      uVar22 = vcmpps_avx512vl(auVar110,auVar102,6);
      bVar84 = (byte)uVar20 | (byte)uVar22;
      auVar135._0_4_ =
           (uint)(bVar84 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar84 & 1) * (int)fVar152;
      bVar12 = (bool)(bVar84 >> 1 & 1);
      auVar135._4_4_ = (uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * (int)fVar240;
      bVar12 = (bool)(bVar84 >> 2 & 1);
      auVar135._8_4_ = (uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * (int)fVar241;
      bVar12 = (bool)(bVar84 >> 3 & 1);
      auVar135._12_4_ = (uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * (int)fVar242;
      bVar12 = (bool)(bVar84 >> 4 & 1);
      auVar135._16_4_ = (uint)bVar12 * auVar115._16_4_ | (uint)!bVar12 * (int)fVar249;
      bVar12 = (bool)(bVar84 >> 5 & 1);
      auVar135._20_4_ = (uint)bVar12 * auVar115._20_4_ | (uint)!bVar12 * (int)fVar250;
      bVar12 = (bool)(bVar84 >> 6 & 1);
      auVar135._24_4_ = (uint)bVar12 * auVar115._24_4_ | (uint)!bVar12 * (int)fVar251;
      auVar135._28_4_ =
           (uint)(bVar84 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar109._28_4_;
      auVar248 = ZEXT3264(auVar135);
      local_460 = vminps_avx(auVar101,auVar135);
      auVar247 = ZEXT3264(local_460);
      uVar20 = vcmpps_avx512vl(_local_740,local_460,2);
      bVar78 = bVar78 & 0x7f & (byte)uVar20;
      if (bVar78 != 0) {
        auVar103 = vmaxps_avx(auVar123,auVar112);
        auVar109 = vminps_avx512vl(local_680,auVar108);
        auVar58 = ZEXT412(0);
        auVar254 = ZEXT1264(auVar58) << 0x20;
        auVar109 = vmaxps_avx(auVar109,ZEXT1232(auVar58) << 0x20);
        auVar110 = vminps_avx512vl(local_6a0,auVar108);
        auVar259 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar54._4_4_ = (auVar109._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar109._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar109._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar109._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar109._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar109._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar109._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar109._28_4_ + 7.0;
        auVar94 = vfmadd213ps_fma(auVar54,local_8a0,auVar232);
        local_680 = ZEXT1632(auVar94);
        auVar109 = vmaxps_avx(auVar110,ZEXT1232(auVar58) << 0x20);
        auVar55._4_4_ = (auVar109._4_4_ + 1.0) * 0.125;
        auVar55._0_4_ = (auVar109._0_4_ + 0.0) * 0.125;
        auVar55._8_4_ = (auVar109._8_4_ + 2.0) * 0.125;
        auVar55._12_4_ = (auVar109._12_4_ + 3.0) * 0.125;
        auVar55._16_4_ = (auVar109._16_4_ + 4.0) * 0.125;
        auVar55._20_4_ = (auVar109._20_4_ + 5.0) * 0.125;
        auVar55._24_4_ = (auVar109._24_4_ + 6.0) * 0.125;
        auVar55._28_4_ = auVar109._28_4_ + 7.0;
        auVar94 = vfmadd213ps_fma(auVar55,local_8a0,auVar232);
        local_6a0 = ZEXT1632(auVar94);
        auVar224._0_4_ = auVar103._0_4_ * auVar103._0_4_;
        auVar224._4_4_ = auVar103._4_4_ * auVar103._4_4_;
        auVar224._8_4_ = auVar103._8_4_ * auVar103._8_4_;
        auVar224._12_4_ = auVar103._12_4_ * auVar103._12_4_;
        auVar224._16_4_ = auVar103._16_4_ * auVar103._16_4_;
        auVar224._20_4_ = auVar103._20_4_ * auVar103._20_4_;
        auVar224._24_4_ = auVar103._24_4_ * auVar103._24_4_;
        auVar224._28_4_ = 0;
        auVar103 = vsubps_avx(auVar118,auVar224);
        auVar104 = vmulps_avx512vl(auVar104,auVar103);
        auVar104 = vsubps_avx512vl(auVar122,auVar104);
        uVar20 = vcmpps_avx512vl(auVar104,ZEXT1232(auVar58) << 0x20,5);
        bVar84 = (byte)uVar20;
        if (bVar84 == 0) {
          auVar106 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar108 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar248 = ZEXT864(0) << 0x20;
          auVar136._8_4_ = 0x7f800000;
          auVar136._0_8_ = 0x7f8000007f800000;
          auVar136._12_4_ = 0x7f800000;
          auVar136._16_4_ = 0x7f800000;
          auVar136._20_4_ = 0x7f800000;
          auVar136._24_4_ = 0x7f800000;
          auVar136._28_4_ = 0x7f800000;
          auVar137._8_4_ = 0xff800000;
          auVar137._0_8_ = 0xff800000ff800000;
          auVar137._12_4_ = 0xff800000;
          auVar137._16_4_ = 0xff800000;
          auVar137._20_4_ = 0xff800000;
          auVar137._24_4_ = 0xff800000;
          auVar137._28_4_ = 0xff800000;
        }
        else {
          auVar91 = vxorps_avx512vl(auVar113._0_16_,auVar113._0_16_);
          uVar89 = vcmpps_avx512vl(auVar104,auVar123,5);
          auVar104 = vsqrtps_avx(auVar104);
          auVar235._0_4_ = auVar105._0_4_ + auVar105._0_4_;
          auVar235._4_4_ = auVar105._4_4_ + auVar105._4_4_;
          auVar235._8_4_ = auVar105._8_4_ + auVar105._8_4_;
          auVar235._12_4_ = auVar105._12_4_ + auVar105._12_4_;
          auVar235._16_4_ = auVar105._16_4_ + auVar105._16_4_;
          auVar235._20_4_ = auVar105._20_4_ + auVar105._20_4_;
          auVar235._24_4_ = auVar105._24_4_ + auVar105._24_4_;
          auVar235._28_4_ = auVar105._28_4_ + auVar105._28_4_;
          auVar109 = vrcp14ps_avx512vl(auVar235);
          auVar108 = vfnmadd213ps_avx512vl(auVar235,auVar109,auVar108);
          auVar94 = vfmadd132ps_fma(auVar108,auVar109,auVar109);
          auVar29._8_4_ = 0x80000000;
          auVar29._0_8_ = 0x8000000080000000;
          auVar29._12_4_ = 0x80000000;
          auVar29._16_4_ = 0x80000000;
          auVar29._20_4_ = 0x80000000;
          auVar29._24_4_ = 0x80000000;
          auVar29._28_4_ = 0x80000000;
          auVar108 = vxorps_avx512vl(auVar117,auVar29);
          auVar108 = vsubps_avx(auVar108,auVar104);
          auVar56._4_4_ = auVar108._4_4_ * auVar94._4_4_;
          auVar56._0_4_ = auVar108._0_4_ * auVar94._0_4_;
          auVar56._8_4_ = auVar108._8_4_ * auVar94._8_4_;
          auVar56._12_4_ = auVar108._12_4_ * auVar94._12_4_;
          auVar56._16_4_ = auVar108._16_4_ * 0.0;
          auVar56._20_4_ = auVar108._20_4_ * 0.0;
          auVar56._24_4_ = auVar108._24_4_ * 0.0;
          auVar56._28_4_ = 0x3e000000;
          auVar104 = vsubps_avx512vl(auVar104,auVar117);
          auVar263._0_4_ = auVar104._0_4_ * auVar94._0_4_;
          auVar263._4_4_ = auVar104._4_4_ * auVar94._4_4_;
          auVar263._8_4_ = auVar104._8_4_ * auVar94._8_4_;
          auVar263._12_4_ = auVar104._12_4_ * auVar94._12_4_;
          auVar263._16_4_ = auVar104._16_4_ * 0.0;
          auVar263._20_4_ = auVar104._20_4_ * 0.0;
          auVar263._24_4_ = auVar104._24_4_ * 0.0;
          auVar263._28_4_ = 0;
          auVar264 = ZEXT3264(auVar263);
          auVar104 = vfmadd213ps_avx512vl(auVar119,auVar56,auVar120);
          auVar57._4_4_ = auVar100._4_4_ * auVar104._4_4_;
          auVar57._0_4_ = auVar100._0_4_ * auVar104._0_4_;
          auVar57._8_4_ = auVar100._8_4_ * auVar104._8_4_;
          auVar57._12_4_ = auVar100._12_4_ * auVar104._12_4_;
          auVar57._16_4_ = auVar100._16_4_ * auVar104._16_4_;
          auVar57._20_4_ = auVar100._20_4_ * auVar104._20_4_;
          auVar57._24_4_ = auVar100._24_4_ * auVar104._24_4_;
          auVar57._28_4_ = auVar108._28_4_;
          auVar108 = vmulps_avx512vl(local_5c0,auVar56);
          auVar104 = vmulps_avx512vl(local_8e0,auVar56);
          auVar109 = vmulps_avx512vl(local_900,auVar56);
          auVar110 = vfmadd213ps_avx512vl(auVar106,auVar57,local_960);
          auVar108 = vsubps_avx512vl(auVar108,auVar110);
          auVar110 = vfmadd213ps_avx512vl(auVar107,auVar57,auVar208);
          auVar104 = vsubps_avx512vl(auVar104,auVar110);
          auVar94 = vfmadd213ps_fma(auVar57,local_700,local_8c0);
          auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar94));
          auVar248 = ZEXT3264(auVar109);
          auVar109 = vfmadd213ps_avx512vl(auVar119,auVar263,auVar120);
          auVar109 = vmulps_avx512vl(auVar100,auVar109);
          auVar110 = vmulps_avx512vl(local_5c0,auVar263);
          auVar111 = vmulps_avx512vl(local_8e0,auVar263);
          auVar112 = vmulps_avx512vl(local_900,auVar263);
          auVar94 = vfmadd213ps_fma(auVar106,auVar109,local_960);
          auVar106 = vsubps_avx(auVar110,ZEXT1632(auVar94));
          auVar254 = ZEXT3264(auVar106);
          auVar94 = vfmadd213ps_fma(auVar107,auVar109,auVar208);
          auVar106 = vsubps_avx512vl(auVar111,ZEXT1632(auVar94));
          auVar94 = vfmadd213ps_fma(local_700,auVar109,local_8c0);
          auVar107 = vsubps_avx512vl(auVar112,ZEXT1632(auVar94));
          auVar163._8_4_ = 0x7f800000;
          auVar163._0_8_ = 0x7f8000007f800000;
          auVar163._12_4_ = 0x7f800000;
          auVar163._16_4_ = 0x7f800000;
          auVar163._20_4_ = 0x7f800000;
          auVar163._24_4_ = 0x7f800000;
          auVar163._28_4_ = 0x7f800000;
          auVar109 = vblendmps_avx512vl(auVar163,auVar56);
          bVar12 = (bool)((byte)uVar89 & 1);
          auVar136._0_4_ = (uint)bVar12 * auVar109._0_4_ | (uint)!bVar12 * auVar253._0_4_;
          bVar12 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar253._4_4_;
          bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar253._8_4_;
          bVar12 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar253._12_4_;
          iVar1 = (uint)((byte)(uVar89 >> 4) & 1) * auVar109._16_4_;
          auVar136._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar89 >> 5) & 1) * auVar109._20_4_;
          auVar136._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar89 >> 6) & 1) * auVar109._24_4_;
          auVar136._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar89 >> 7) * auVar109._28_4_;
          auVar136._28_4_ = iVar4;
          auVar164._8_4_ = 0xff800000;
          auVar164._0_8_ = 0xff800000ff800000;
          auVar164._12_4_ = 0xff800000;
          auVar164._16_4_ = 0xff800000;
          auVar164._20_4_ = 0xff800000;
          auVar164._24_4_ = 0xff800000;
          auVar164._28_4_ = 0xff800000;
          auVar109 = vblendmps_avx512vl(auVar164,auVar263);
          bVar12 = (bool)((byte)uVar89 & 1);
          auVar137._0_4_ = (uint)bVar12 * auVar109._0_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar137._16_4_ = (uint)bVar12 * auVar109._16_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar137._20_4_ = (uint)bVar12 * auVar109._20_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar137._24_4_ = (uint)bVar12 * auVar109._24_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = SUB81(uVar89 >> 7,0);
          auVar137._28_4_ = (uint)bVar12 * auVar109._28_4_ | (uint)!bVar12 * -0x800000;
          auVar244._8_4_ = 0x7fffffff;
          auVar244._0_8_ = 0x7fffffff7fffffff;
          auVar244._12_4_ = 0x7fffffff;
          auVar244._16_4_ = 0x7fffffff;
          auVar244._20_4_ = 0x7fffffff;
          auVar244._24_4_ = 0x7fffffff;
          auVar244._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar121,auVar244);
          auVar259 = ZEXT3264(local_5e0);
          auVar109 = vmaxps_avx(local_5e0,auVar137);
          auVar30._8_4_ = 0x36000000;
          auVar30._0_8_ = 0x3600000036000000;
          auVar30._12_4_ = 0x36000000;
          auVar30._16_4_ = 0x36000000;
          auVar30._20_4_ = 0x36000000;
          auVar30._24_4_ = 0x36000000;
          auVar30._28_4_ = 0x36000000;
          auVar109 = vmulps_avx512vl(auVar109,auVar30);
          auVar105 = vandps_avx(auVar105,auVar244);
          uVar85 = vcmpps_avx512vl(auVar105,auVar109,1);
          uVar89 = uVar89 & uVar85;
          bVar81 = (byte)uVar89;
          if (bVar81 != 0) {
            uVar85 = vcmpps_avx512vl(auVar103,ZEXT1632(auVar91),2);
            auVar245._8_4_ = 0xff800000;
            auVar245._0_8_ = 0xff800000ff800000;
            auVar245._12_4_ = 0xff800000;
            auVar245._16_4_ = 0xff800000;
            auVar245._20_4_ = 0xff800000;
            auVar245._24_4_ = 0xff800000;
            auVar245._28_4_ = 0xff800000;
            auVar256._8_4_ = 0x7f800000;
            auVar256._0_8_ = 0x7f8000007f800000;
            auVar256._12_4_ = 0x7f800000;
            auVar256._16_4_ = 0x7f800000;
            auVar256._20_4_ = 0x7f800000;
            auVar256._24_4_ = 0x7f800000;
            auVar256._28_4_ = 0x7f800000;
            auVar105 = vblendmps_avx512vl(auVar256,auVar245);
            bVar83 = (byte)uVar85;
            uVar90 = (uint)(bVar83 & 1) * auVar105._0_4_ |
                     (uint)!(bool)(bVar83 & 1) * auVar109._0_4_;
            bVar12 = (bool)((byte)(uVar85 >> 1) & 1);
            uVar145 = (uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar109._4_4_;
            bVar12 = (bool)((byte)(uVar85 >> 2) & 1);
            uVar146 = (uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar109._8_4_;
            bVar12 = (bool)((byte)(uVar85 >> 3) & 1);
            uVar147 = (uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar109._12_4_;
            bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
            uVar148 = (uint)bVar12 * auVar105._16_4_ | (uint)!bVar12 * auVar109._16_4_;
            bVar12 = (bool)((byte)(uVar85 >> 5) & 1);
            uVar149 = (uint)bVar12 * auVar105._20_4_ | (uint)!bVar12 * auVar109._20_4_;
            bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
            uVar150 = (uint)bVar12 * auVar105._24_4_ | (uint)!bVar12 * auVar109._24_4_;
            bVar12 = SUB81(uVar85 >> 7,0);
            uVar151 = (uint)bVar12 * auVar105._28_4_ | (uint)!bVar12 * auVar109._28_4_;
            auVar136._0_4_ = (bVar81 & 1) * uVar90 | !(bool)(bVar81 & 1) * auVar136._0_4_;
            bVar12 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar136._4_4_ = bVar12 * uVar145 | !bVar12 * auVar136._4_4_;
            bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar136._8_4_ = bVar12 * uVar146 | !bVar12 * auVar136._8_4_;
            bVar12 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar136._12_4_ = bVar12 * uVar147 | !bVar12 * auVar136._12_4_;
            bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar136._16_4_ = bVar12 * uVar148 | (uint)!bVar12 * iVar1;
            bVar12 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar136._20_4_ = bVar12 * uVar149 | (uint)!bVar12 * iVar2;
            bVar12 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar136._24_4_ = bVar12 * uVar150 | (uint)!bVar12 * iVar3;
            bVar12 = SUB81(uVar89 >> 7,0);
            auVar136._28_4_ = bVar12 * uVar151 | (uint)!bVar12 * iVar4;
            auVar105 = vblendmps_avx512vl(auVar245,auVar256);
            bVar12 = (bool)((byte)(uVar85 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar85 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar85 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar85 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar85 >> 6) & 1);
            bVar18 = SUB81(uVar85 >> 7,0);
            auVar137._0_4_ =
                 (uint)(bVar81 & 1) *
                 ((uint)(bVar83 & 1) * auVar105._0_4_ | !(bool)(bVar83 & 1) * uVar90) |
                 !(bool)(bVar81 & 1) * auVar137._0_4_;
            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar137._4_4_ =
                 (uint)bVar88 * ((uint)bVar12 * auVar105._4_4_ | !bVar12 * uVar145) |
                 !bVar88 * auVar137._4_4_;
            bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar137._8_4_ =
                 (uint)bVar12 * ((uint)bVar13 * auVar105._8_4_ | !bVar13 * uVar146) |
                 !bVar12 * auVar137._8_4_;
            bVar12 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar137._12_4_ =
                 (uint)bVar12 * ((uint)bVar14 * auVar105._12_4_ | !bVar14 * uVar147) |
                 !bVar12 * auVar137._12_4_;
            bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar137._16_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar105._16_4_ | !bVar15 * uVar148) |
                 !bVar12 * auVar137._16_4_;
            bVar12 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar137._20_4_ =
                 (uint)bVar12 * ((uint)bVar16 * auVar105._20_4_ | !bVar16 * uVar149) |
                 !bVar12 * auVar137._20_4_;
            bVar12 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar137._24_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar105._24_4_ | !bVar17 * uVar150) |
                 !bVar12 * auVar137._24_4_;
            bVar12 = SUB81(uVar89 >> 7,0);
            auVar137._28_4_ =
                 (uint)bVar12 * ((uint)bVar18 * auVar105._28_4_ | !bVar18 * uVar151) |
                 !bVar12 * auVar137._28_4_;
            bVar84 = (~bVar81 | bVar83) & bVar84;
          }
        }
        auVar255._8_4_ = 0x7fffffff;
        auVar255._0_8_ = 0x7fffffff7fffffff;
        auVar255._12_4_ = 0x7fffffff;
        auVar105 = vmulps_avx512vl(local_900,auVar107);
        auVar105 = vfmadd231ps_avx512vl(auVar105,local_8e0,auVar106);
        auVar105 = vfmadd231ps_avx512vl(auVar105,local_5c0,auVar254._0_32_);
        _local_1c0 = _local_740;
        local_1a0 = vminps_avx(local_460,auVar136);
        auVar239._8_4_ = 0x7fffffff;
        auVar239._0_8_ = 0x7fffffff7fffffff;
        auVar239._12_4_ = 0x7fffffff;
        auVar239._16_4_ = 0x7fffffff;
        auVar239._20_4_ = 0x7fffffff;
        auVar239._24_4_ = 0x7fffffff;
        auVar239._28_4_ = 0x7fffffff;
        auVar105 = vandps_avx(auVar105,auVar239);
        _local_6e0 = vmaxps_avx(_local_740,auVar137);
        auVar238 = ZEXT3264(_local_6e0);
        _local_480 = _local_6e0;
        auVar165._8_4_ = 0x3e99999a;
        auVar165._0_8_ = 0x3e99999a3e99999a;
        auVar165._12_4_ = 0x3e99999a;
        auVar165._16_4_ = 0x3e99999a;
        auVar165._20_4_ = 0x3e99999a;
        auVar165._24_4_ = 0x3e99999a;
        auVar165._28_4_ = 0x3e99999a;
        uVar20 = vcmpps_avx512vl(auVar105,auVar165,1);
        uVar22 = vcmpps_avx512vl(_local_740,local_1a0,2);
        bVar81 = (byte)uVar22 & bVar78;
        uVar21 = vcmpps_avx512vl(_local_6e0,local_460,2);
        if ((bVar78 & ((byte)uVar21 | (byte)uVar22)) == 0) {
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar265 = ZEXT3264(auVar105);
        }
        else {
          auVar105 = vmulps_avx512vl(local_900,auVar248._0_32_);
          auVar105 = vfmadd213ps_avx512vl(auVar104,local_8e0,auVar105);
          auVar105 = vfmadd213ps_avx512vl(auVar108,local_5c0,auVar105);
          auVar105 = vandps_avx(auVar105,auVar239);
          uVar22 = vcmpps_avx512vl(auVar105,auVar165,1);
          bVar83 = (byte)uVar22 | ~bVar84;
          auVar166._8_4_ = 2;
          auVar166._0_8_ = 0x200000002;
          auVar166._12_4_ = 2;
          auVar166._16_4_ = 2;
          auVar166._20_4_ = 2;
          auVar166._24_4_ = 2;
          auVar166._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar105 = vpblendmd_avx512vl(auVar166,auVar31);
          local_440._0_4_ = (uint)(bVar83 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar83 & 1) * 2;
          bVar12 = (bool)(bVar83 >> 1 & 1);
          local_440._4_4_ = (uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar83 >> 2 & 1);
          local_440._8_4_ = (uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar83 >> 3 & 1);
          local_440._12_4_ = (uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar83 >> 4 & 1);
          local_440._16_4_ = (uint)bVar12 * auVar105._16_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar83 >> 5 & 1);
          local_440._20_4_ = (uint)bVar12 * auVar105._20_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar83 >> 6 & 1);
          local_440._24_4_ = (uint)bVar12 * auVar105._24_4_ | (uint)!bVar12 * 2;
          local_440._28_4_ = (uint)(bVar83 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar83 >> 7) * 2;
          local_600 = vpbroadcastd_avx512vl();
          uVar22 = vpcmpd_avx512vl(local_600,local_440,5);
          bVar83 = (byte)uVar22 & bVar81;
          if (bVar83 != 0) {
            auVar253 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar94 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar91 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar5 = vminps_avx(auVar253,auVar91);
            auVar253 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar91 = vmaxps_avx(auVar94,auVar253);
            auVar94 = vandps_avx(auVar255,auVar5);
            auVar253 = vandps_avx(auVar255,auVar91);
            auVar94 = vmaxps_avx(auVar94,auVar253);
            auVar253 = vmovshdup_avx(auVar94);
            auVar253 = vmaxss_avx(auVar253,auVar94);
            auVar94 = vshufpd_avx(auVar94,auVar94,1);
            auVar94 = vmaxss_avx(auVar94,auVar253);
            fVar152 = auVar94._0_4_ * 1.9073486e-06;
            local_7b0 = vshufps_avx(auVar91,auVar91,0xff);
            local_6c0 = (float)local_740._0_4_ + (float)local_720._0_4_;
            fStack_6bc = (float)local_740._4_4_ + (float)local_720._4_4_;
            fStack_6b8 = fStack_738 + fStack_718;
            fStack_6b4 = fStack_734 + fStack_714;
            fStack_6b0 = fStack_730 + fStack_710;
            fStack_6ac = fStack_72c + fStack_70c;
            fStack_6a8 = fStack_728 + fStack_708;
            fStack_6a4 = fStack_724 + fStack_704;
            do {
              auVar167._8_4_ = 0x7f800000;
              auVar167._0_8_ = 0x7f8000007f800000;
              auVar167._12_4_ = 0x7f800000;
              auVar167._16_4_ = 0x7f800000;
              auVar167._20_4_ = 0x7f800000;
              auVar167._24_4_ = 0x7f800000;
              auVar167._28_4_ = 0x7f800000;
              auVar105 = vblendmps_avx512vl(auVar167,_local_740);
              auVar138._0_4_ =
                   (uint)(bVar83 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar83 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar83 >> 1 & 1);
              auVar138._4_4_ = (uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar83 >> 2 & 1);
              auVar138._8_4_ = (uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar83 >> 3 & 1);
              auVar138._12_4_ = (uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar83 >> 4 & 1);
              auVar138._16_4_ = (uint)bVar12 * auVar105._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar83 >> 5 & 1);
              auVar138._20_4_ = (uint)bVar12 * auVar105._20_4_ | (uint)!bVar12 * 0x7f800000;
              auVar138._24_4_ =
                   (uint)(bVar83 >> 6) * auVar105._24_4_ | (uint)!(bool)(bVar83 >> 6) * 0x7f800000;
              auVar138._28_4_ = 0x7f800000;
              auVar105 = vshufps_avx(auVar138,auVar138,0xb1);
              auVar105 = vminps_avx(auVar138,auVar105);
              auVar103 = vshufpd_avx(auVar105,auVar105,5);
              auVar105 = vminps_avx(auVar105,auVar103);
              auVar103 = vpermpd_avx2(auVar105,0x4e);
              auVar105 = vminps_avx(auVar105,auVar103);
              uVar22 = vcmpps_avx512vl(auVar138,auVar105,0);
              bVar79 = (byte)uVar22 & bVar83;
              bVar80 = bVar83;
              if (bVar79 != 0) {
                bVar80 = bVar79;
              }
              iVar2 = 0;
              for (uVar90 = (uint)bVar80; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar90 = *(uint *)(local_680 + (uint)(iVar2 << 2));
              uVar145 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
              fVar240 = auVar19._0_4_;
              if ((float)local_880._0_4_ < 0.0) {
                fVar240 = sqrtf((float)local_880._0_4_);
              }
              auVar254 = ZEXT464(uVar90);
              auVar247 = ZEXT464(uVar145);
              lVar87 = 4;
              do {
                fVar241 = auVar247._0_4_;
                auVar155._4_4_ = fVar241;
                auVar155._0_4_ = fVar241;
                auVar155._8_4_ = fVar241;
                auVar155._12_4_ = fVar241;
                auVar94 = vfmadd132ps_fma(auVar155,ZEXT816(0) << 0x40,local_870);
                fVar252 = auVar254._0_4_;
                fVar237 = 1.0 - fVar252;
                fVar250 = fVar237 * fVar237 * fVar237;
                fVar242 = fVar252 * fVar252;
                fVar243 = fVar252 * fVar242;
                auVar253 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar250),
                                           ZEXT416((uint)fVar243));
                fVar249 = fVar252 * fVar237;
                auVar92 = ZEXT416((uint)fVar237);
                auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * fVar249 * 6.0)),
                                         ZEXT416((uint)(fVar249 * fVar237)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar243),
                                          ZEXT416((uint)fVar250));
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * fVar237 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar252 * fVar249)));
                fVar250 = fVar250 * 0.16666667;
                fVar251 = (auVar253._0_4_ + auVar5._0_4_) * 0.16666667;
                fVar216 = (auVar91._0_4_ + auVar95._0_4_) * 0.16666667;
                fVar243 = fVar243 * 0.16666667;
                auVar198._0_4_ = fVar243 * (float)local_860._0_4_;
                auVar198._4_4_ = fVar243 * (float)local_860._4_4_;
                auVar198._8_4_ = fVar243 * fStack_858;
                auVar198._12_4_ = fVar243 * fStack_854;
                auVar228._4_4_ = fVar216;
                auVar228._0_4_ = fVar216;
                auVar228._8_4_ = fVar216;
                auVar228._12_4_ = fVar216;
                auVar253 = vfmadd132ps_fma(auVar228,auVar198,local_820._0_16_);
                auVar199._4_4_ = fVar251;
                auVar199._0_4_ = fVar251;
                auVar199._8_4_ = fVar251;
                auVar199._12_4_ = fVar251;
                auVar253 = vfmadd132ps_fma(auVar199,auVar253,local_840._0_16_);
                auVar178._4_4_ = fVar250;
                auVar178._0_4_ = fVar250;
                auVar178._8_4_ = fVar250;
                auVar178._12_4_ = fVar250;
                auVar253 = vfmadd132ps_fma(auVar178,auVar253,local_800._0_16_);
                local_700._0_16_ = auVar253;
                auVar94 = vsubps_avx(auVar94,auVar253);
                local_8a0._0_16_ = auVar94;
                auVar94 = vdpps_avx(auVar94,auVar94,0x7f);
                auVar253 = auVar254._0_16_;
                local_8c0._0_16_ = auVar94;
                if (auVar94._0_4_ < 0.0) {
                  local_960._0_4_ = fVar242;
                  auVar259._0_4_ = sqrtf(auVar94._0_4_);
                  auVar259._4_60_ = extraout_var;
                  auVar94 = auVar259._0_16_;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar94,auVar94);
                  local_960._0_4_ = fVar242;
                }
                auVar5 = vfnmsub213ss_fma(auVar253,auVar253,ZEXT416((uint)(fVar249 * 4.0)));
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * 4.0)),auVar92,auVar92);
                fVar242 = fVar237 * -fVar237 * 0.5;
                fVar249 = auVar5._0_4_ * 0.5;
                fVar250 = auVar91._0_4_ * 0.5;
                local_960._0_4_ = (float)local_960._0_4_ * 0.5;
                auVar218._0_4_ = (float)local_960._0_4_ * (float)local_860._0_4_;
                auVar218._4_4_ = (float)local_960._0_4_ * (float)local_860._4_4_;
                auVar218._8_4_ = (float)local_960._0_4_ * fStack_858;
                auVar218._12_4_ = (float)local_960._0_4_ * fStack_854;
                auVar179._4_4_ = fVar250;
                auVar179._0_4_ = fVar250;
                auVar179._8_4_ = fVar250;
                auVar179._12_4_ = fVar250;
                auVar91 = vfmadd132ps_fma(auVar179,auVar218,local_820._0_16_);
                auVar200._4_4_ = fVar249;
                auVar200._0_4_ = fVar249;
                auVar200._8_4_ = fVar249;
                auVar200._12_4_ = fVar249;
                auVar91 = vfmadd132ps_fma(auVar200,auVar91,local_840._0_16_);
                auVar260._4_4_ = fVar242;
                auVar260._0_4_ = fVar242;
                auVar260._8_4_ = fVar242;
                auVar260._12_4_ = fVar242;
                local_960._0_16_ = vfmadd132ps_fma(auVar260,auVar91,local_800._0_16_);
                local_760 = vdpps_avx(local_960._0_16_,local_960._0_16_,0x7f);
                auVar59._12_4_ = 0;
                auVar59._0_12_ = ZEXT812(0);
                fVar242 = local_760._0_4_;
                auVar91 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar242));
                fVar249 = auVar91._0_4_;
                local_770 = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar242));
                auVar91 = vfnmadd213ss_fma(local_770,local_760,ZEXT416(0x40000000));
                uVar90 = auVar94._0_4_;
                local_750 = fVar237;
                fStack_74c = fVar237;
                fStack_748 = fVar237;
                fStack_744 = fVar237;
                if (fVar242 < -fVar242) {
                  auVar264._0_4_ = sqrtf(fVar242);
                  auVar264._4_60_ = extraout_var_00;
                  auVar94 = ZEXT416(uVar90);
                  auVar95 = auVar264._0_16_;
                  auVar5 = local_960._0_16_;
                }
                else {
                  auVar95 = vsqrtss_avx512f(local_760,local_760);
                  auVar5 = local_960._0_16_;
                }
                fVar242 = fVar249 * 1.5 + fVar242 * -0.5 * fVar249 * fVar249 * fVar249;
                auVar156._0_4_ = auVar5._0_4_ * fVar242;
                auVar156._4_4_ = auVar5._4_4_ * fVar242;
                auVar156._8_4_ = auVar5._8_4_ * fVar242;
                auVar156._12_4_ = auVar5._12_4_ * fVar242;
                auVar266 = vdpps_avx(local_8a0._0_16_,auVar156,0x7f);
                fVar251 = auVar94._0_4_;
                fVar249 = auVar266._0_4_;
                auVar157._0_4_ = fVar249 * fVar249;
                auVar157._4_4_ = auVar266._4_4_ * auVar266._4_4_;
                auVar157._8_4_ = auVar266._8_4_ * auVar266._8_4_;
                auVar157._12_4_ = auVar266._12_4_ * auVar266._12_4_;
                auVar96 = vsubps_avx512vl(local_8c0._0_16_,auVar157);
                fVar250 = auVar96._0_4_;
                auVar180._4_12_ = ZEXT812(0) << 0x20;
                auVar180._0_4_ = fVar250;
                auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar180);
                auVar98 = vmulss_avx512f(auVar97,ZEXT416(0x3fc00000));
                auVar99 = vmulss_avx512f(auVar96,ZEXT416(0xbf000000));
                if (fVar250 < 0.0) {
                  local_790 = fVar242;
                  fStack_78c = fVar242;
                  fStack_788 = fVar242;
                  fStack_784 = fVar242;
                  local_780 = auVar97;
                  fVar250 = sqrtf(fVar250);
                  auVar99 = ZEXT416(auVar99._0_4_);
                  auVar98 = ZEXT416(auVar98._0_4_);
                  auVar95 = ZEXT416(auVar95._0_4_);
                  auVar94 = ZEXT416(uVar90);
                  auVar5 = local_960._0_16_;
                  auVar97 = local_780;
                  fVar242 = local_790;
                  fVar216 = fStack_78c;
                  fVar243 = fStack_788;
                  fVar237 = fStack_784;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                  fVar250 = auVar96._0_4_;
                  fVar216 = fVar242;
                  fVar243 = fVar242;
                  fVar237 = fVar242;
                }
                auVar264 = ZEXT1664(auVar5);
                auVar248 = ZEXT1664(local_8a0._0_16_);
                auVar255._8_4_ = 0x7fffffff;
                auVar255._0_8_ = 0x7fffffff7fffffff;
                auVar255._12_4_ = 0x7fffffff;
                auVar268 = ZEXT3264(local_8e0);
                auVar267 = ZEXT3264(local_900);
                auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar92,auVar253);
                auVar253 = vfmadd231ss_fma(auVar92,auVar253,SUB6416(ZEXT464(0xc0000000),0));
                auVar201._0_4_ = fVar252 * (float)local_860._0_4_;
                auVar201._4_4_ = fVar252 * (float)local_860._4_4_;
                auVar201._8_4_ = fVar252 * fStack_858;
                auVar201._12_4_ = fVar252 * fStack_854;
                auVar219._0_4_ = auVar253._0_4_;
                auVar219._4_4_ = auVar219._0_4_;
                auVar219._8_4_ = auVar219._0_4_;
                auVar219._12_4_ = auVar219._0_4_;
                auVar253 = vfmadd132ps_fma(auVar219,auVar201,local_820._0_16_);
                auVar181._0_4_ = auVar96._0_4_;
                auVar181._4_4_ = auVar181._0_4_;
                auVar181._8_4_ = auVar181._0_4_;
                auVar181._12_4_ = auVar181._0_4_;
                auVar253 = vfmadd132ps_fma(auVar181,auVar253,local_840._0_16_);
                auVar69._4_4_ = fStack_74c;
                auVar69._0_4_ = local_750;
                auVar69._8_4_ = fStack_748;
                auVar69._12_4_ = fStack_744;
                auVar253 = vfmadd132ps_fma(auVar69,auVar253,local_800._0_16_);
                auVar182._0_4_ = auVar253._0_4_ * (float)local_760._0_4_;
                auVar182._4_4_ = auVar253._4_4_ * (float)local_760._0_4_;
                auVar182._8_4_ = auVar253._8_4_ * (float)local_760._0_4_;
                auVar182._12_4_ = auVar253._12_4_ * (float)local_760._0_4_;
                auVar253 = vdpps_avx(auVar5,auVar253,0x7f);
                fVar197 = auVar253._0_4_;
                auVar202._0_4_ = auVar5._0_4_ * fVar197;
                auVar202._4_4_ = auVar5._4_4_ * fVar197;
                auVar202._8_4_ = auVar5._8_4_ * fVar197;
                auVar202._12_4_ = auVar5._12_4_ * fVar197;
                auVar253 = vsubps_avx(auVar182,auVar202);
                fVar197 = auVar91._0_4_ * (float)local_770._0_4_;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar140._16_16_ = local_900._16_16_;
                auVar96 = vxorps_avx512vl(auVar5,auVar23);
                auVar229._0_4_ = fVar242 * auVar253._0_4_ * fVar197;
                auVar229._4_4_ = fVar216 * auVar253._4_4_ * fVar197;
                auVar229._8_4_ = fVar243 * auVar253._8_4_ * fVar197;
                auVar229._12_4_ = fVar237 * auVar253._12_4_ * fVar197;
                auVar259 = ZEXT1664(auVar156);
                auVar253 = vdpps_avx(auVar96,auVar156,0x7f);
                auVar92 = vmaxss_avx(ZEXT416((uint)fVar152),
                                     ZEXT416((uint)(fVar241 * fVar240 * 1.9073486e-06)));
                auVar95 = vdivss_avx512f(ZEXT416((uint)fVar152),auVar95);
                auVar91 = vdpps_avx(local_8a0._0_16_,auVar229,0x7f);
                auVar94 = vfmadd213ss_fma(auVar94,ZEXT416((uint)fVar152),auVar92);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)(fVar251 + 1.0)),auVar95,auVar94);
                auVar94 = vdpps_avx(local_870,auVar156,0x7f);
                fVar242 = auVar253._0_4_ + auVar91._0_4_;
                auVar253 = vdpps_avx(local_8a0._0_16_,auVar96,0x7f);
                auVar96 = vmulss_avx512f(auVar99,auVar97);
                auVar97 = vmulss_avx512f(auVar97,auVar97);
                auVar91 = vdpps_avx(local_8a0._0_16_,local_870,0x7f);
                auVar98 = vaddss_avx512f(auVar98,ZEXT416((uint)(auVar96._0_4_ * auVar97._0_4_)));
                auVar97 = vfnmadd231ss_fma(auVar253,auVar266,ZEXT416((uint)fVar242));
                auVar96 = vfnmadd231ss_fma(auVar91,auVar266,auVar94);
                auVar253 = vpermilps_avx(local_700._0_16_,0xff);
                fVar250 = fVar250 - auVar253._0_4_;
                auVar253 = vshufps_avx(auVar5,auVar5,0xff);
                auVar91 = vfmsub213ss_fma(auVar97,auVar98,auVar253);
                fVar251 = auVar96._0_4_ * auVar98._0_4_;
                auVar97 = vfmsub231ss_fma(ZEXT416((uint)(auVar94._0_4_ * auVar91._0_4_)),
                                          ZEXT416((uint)fVar242),ZEXT416((uint)fVar251));
                fVar243 = auVar97._0_4_;
                fVar216 = fVar249 * (auVar91._0_4_ / fVar243);
                auVar238 = ZEXT464((uint)fVar216);
                fVar252 = fVar252 - (fVar249 * (fVar251 / fVar243) -
                                    fVar250 * (auVar94._0_4_ / fVar243));
                auVar254 = ZEXT464((uint)fVar252);
                fVar241 = fVar241 - (fVar250 * (fVar242 / fVar243) - fVar216);
                auVar247 = ZEXT464((uint)fVar241);
                auVar94 = vandps_avx(auVar266,auVar255);
                if (auVar95._0_4_ <= auVar94._0_4_) {
LAB_01e0ef35:
                  bVar12 = false;
                }
                else {
                  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar95._0_4_ + auVar92._0_4_)),local_7b0
                                            ,ZEXT416(0x36000000));
                  auVar94 = vandps_avx(auVar255,ZEXT416((uint)fVar250));
                  if (auVar91._0_4_ <= auVar94._0_4_) goto LAB_01e0ef35;
                  fVar241 = fVar241 + (float)local_7a0._0_4_;
                  auVar247 = ZEXT464((uint)fVar241);
                  bVar12 = true;
                  if ((((fVar217 <= fVar241) &&
                       (fVar242 = *(float *)(ray + k * 4 + 0x100), fVar241 <= fVar242)) &&
                      (0.0 <= fVar252)) && (fVar252 <= 1.0)) {
                    auVar140._0_16_ = ZEXT816(0) << 0x20;
                    auVar139._4_28_ = auVar140._4_28_;
                    auVar139._0_4_ = local_8c0._0_4_;
                    auVar94 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar139._0_16_);
                    fVar249 = auVar94._0_4_;
                    auVar94 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                    pGVar9 = (context->scene->geometries).items[uVar86].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar249 = fVar249 * 1.5 + auVar94._0_4_ * fVar249 * fVar249 * fVar249;
                      auVar183._0_4_ = local_8a0._0_4_ * fVar249;
                      auVar183._4_4_ = local_8a0._4_4_ * fVar249;
                      auVar183._8_4_ = local_8a0._8_4_ * fVar249;
                      auVar183._12_4_ = local_8a0._12_4_ * fVar249;
                      auVar95 = vfmadd213ps_fma(auVar253,auVar183,auVar5);
                      auVar94 = vshufps_avx(auVar183,auVar183,0xc9);
                      auVar253 = vshufps_avx(auVar5,auVar5,0xc9);
                      auVar184._0_4_ = auVar183._0_4_ * auVar253._0_4_;
                      auVar184._4_4_ = auVar183._4_4_ * auVar253._4_4_;
                      auVar184._8_4_ = auVar183._8_4_ * auVar253._8_4_;
                      auVar184._12_4_ = auVar183._12_4_ * auVar253._12_4_;
                      auVar91 = vfmsub231ps_fma(auVar184,auVar5,auVar94);
                      auVar94 = vshufps_avx(auVar91,auVar91,0xc9);
                      auVar253 = vshufps_avx(auVar95,auVar95,0xc9);
                      auVar91 = vshufps_avx(auVar91,auVar91,0xd2);
                      auVar158._0_4_ = auVar95._0_4_ * auVar91._0_4_;
                      auVar158._4_4_ = auVar95._4_4_ * auVar91._4_4_;
                      auVar158._8_4_ = auVar95._8_4_ * auVar91._8_4_;
                      auVar158._12_4_ = auVar95._12_4_ * auVar91._12_4_;
                      auVar94 = vfmsub231ps_fma(auVar158,auVar94,auVar253);
                      uVar154 = auVar94._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar241;
                        uVar8 = vextractps_avx(auVar94,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                        uVar8 = vextractps_avx(auVar94,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar154;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar252;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar7;
                        *(uint *)(ray + k * 4 + 0x240) = uVar86;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar11 = context->user;
                        auVar209._8_4_ = 1;
                        auVar209._0_8_ = 0x100000001;
                        auVar209._12_4_ = 1;
                        auVar209._16_4_ = 1;
                        auVar209._20_4_ = 1;
                        auVar209._24_4_ = 1;
                        auVar209._28_4_ = 1;
                        auVar105 = vpermps_avx2(auVar209,ZEXT1632(auVar94));
                        auVar225._8_4_ = 2;
                        auVar225._0_8_ = 0x200000002;
                        auVar225._12_4_ = 2;
                        auVar225._16_4_ = 2;
                        auVar225._20_4_ = 2;
                        auVar225._24_4_ = 2;
                        auVar225._28_4_ = 2;
                        local_580 = vpermps_avx2(auVar225,ZEXT1632(auVar94));
                        local_5a0[0] = (RTCHitN)auVar105[0];
                        local_5a0[1] = (RTCHitN)auVar105[1];
                        local_5a0[2] = (RTCHitN)auVar105[2];
                        local_5a0[3] = (RTCHitN)auVar105[3];
                        local_5a0[4] = (RTCHitN)auVar105[4];
                        local_5a0[5] = (RTCHitN)auVar105[5];
                        local_5a0[6] = (RTCHitN)auVar105[6];
                        local_5a0[7] = (RTCHitN)auVar105[7];
                        local_5a0[8] = (RTCHitN)auVar105[8];
                        local_5a0[9] = (RTCHitN)auVar105[9];
                        local_5a0[10] = (RTCHitN)auVar105[10];
                        local_5a0[0xb] = (RTCHitN)auVar105[0xb];
                        local_5a0[0xc] = (RTCHitN)auVar105[0xc];
                        local_5a0[0xd] = (RTCHitN)auVar105[0xd];
                        local_5a0[0xe] = (RTCHitN)auVar105[0xe];
                        local_5a0[0xf] = (RTCHitN)auVar105[0xf];
                        local_5a0[0x10] = (RTCHitN)auVar105[0x10];
                        local_5a0[0x11] = (RTCHitN)auVar105[0x11];
                        local_5a0[0x12] = (RTCHitN)auVar105[0x12];
                        local_5a0[0x13] = (RTCHitN)auVar105[0x13];
                        local_5a0[0x14] = (RTCHitN)auVar105[0x14];
                        local_5a0[0x15] = (RTCHitN)auVar105[0x15];
                        local_5a0[0x16] = (RTCHitN)auVar105[0x16];
                        local_5a0[0x17] = (RTCHitN)auVar105[0x17];
                        local_5a0[0x18] = (RTCHitN)auVar105[0x18];
                        local_5a0[0x19] = (RTCHitN)auVar105[0x19];
                        local_5a0[0x1a] = (RTCHitN)auVar105[0x1a];
                        local_5a0[0x1b] = (RTCHitN)auVar105[0x1b];
                        local_5a0[0x1c] = (RTCHitN)auVar105[0x1c];
                        local_5a0[0x1d] = (RTCHitN)auVar105[0x1d];
                        local_5a0[0x1e] = (RTCHitN)auVar105[0x1e];
                        local_5a0[0x1f] = (RTCHitN)auVar105[0x1f];
                        local_560 = uVar154;
                        uStack_55c = uVar154;
                        uStack_558 = uVar154;
                        uStack_554 = uVar154;
                        uStack_550 = uVar154;
                        uStack_54c = uVar154;
                        uStack_548 = uVar154;
                        uStack_544 = uVar154;
                        local_540 = fVar252;
                        fStack_53c = fVar252;
                        fStack_538 = fVar252;
                        fStack_534 = fVar252;
                        fStack_530 = fVar252;
                        fStack_52c = fVar252;
                        fStack_528 = fVar252;
                        fStack_524 = fVar252;
                        local_520 = ZEXT432(0) << 0x20;
                        local_500 = local_640._0_8_;
                        uStack_4f8 = local_640._8_8_;
                        uStack_4f0 = local_640._16_8_;
                        uStack_4e8 = local_640._24_8_;
                        local_4e0 = local_620;
                        auVar105 = vpcmpeqd_avx2(local_620,local_620);
                        local_928[1] = auVar105;
                        *local_928 = auVar105;
                        local_4c0 = pRVar11->instID[0];
                        uStack_4bc = local_4c0;
                        uStack_4b8 = local_4c0;
                        uStack_4b4 = local_4c0;
                        uStack_4b0 = local_4c0;
                        uStack_4ac = local_4c0;
                        uStack_4a8 = local_4c0;
                        uStack_4a4 = local_4c0;
                        local_4a0 = pRVar11->instPrimID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        *(float *)(ray + k * 4 + 0x100) = fVar241;
                        local_7e0 = local_660._0_8_;
                        uStack_7d8 = local_660._8_8_;
                        uStack_7d0 = local_660._16_8_;
                        uStack_7c8 = local_660._24_8_;
                        local_990.valid = (int *)&local_7e0;
                        local_990.geometryUserPtr = pGVar9->userPtr;
                        local_990.context = context->user;
                        local_990.hit = local_5a0;
                        local_990.N = 8;
                        local_990.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar238 = ZEXT464((uint)fVar216);
                          auVar248 = ZEXT1664(local_8a0._0_16_);
                          auVar259 = ZEXT1664(auVar156);
                          auVar264 = ZEXT1664(auVar5);
                          (*pGVar9->intersectionFilterN)(&local_990);
                          auVar247 = ZEXT1664(ZEXT416((uint)fVar241));
                          auVar254 = ZEXT1664(ZEXT416((uint)fVar252));
                          auVar267 = ZEXT3264(local_900);
                          auVar268 = ZEXT3264(local_8e0);
                          auVar255._8_4_ = 0x7fffffff;
                          auVar255._0_8_ = 0x7fffffff7fffffff;
                          auVar255._12_4_ = 0x7fffffff;
                        }
                        auVar65._8_8_ = uStack_7d8;
                        auVar65._0_8_ = local_7e0;
                        auVar65._16_8_ = uStack_7d0;
                        auVar65._24_8_ = uStack_7c8;
                        if (auVar65 != (undefined1  [32])0x0) {
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar238 = ZEXT1664(auVar238._0_16_);
                            auVar248 = ZEXT1664(auVar248._0_16_);
                            auVar259 = ZEXT1664(auVar259._0_16_);
                            auVar264 = ZEXT1664(auVar264._0_16_);
                            (*p_Var10)(&local_990);
                            auVar247 = ZEXT1664(ZEXT416((uint)fVar241));
                            auVar254 = ZEXT1664(ZEXT416((uint)fVar252));
                            auVar267 = ZEXT3264(local_900);
                            auVar268 = ZEXT3264(local_8e0);
                            auVar255._8_4_ = 0x7fffffff;
                            auVar255._0_8_ = 0x7fffffff7fffffff;
                            auVar255._12_4_ = 0x7fffffff;
                          }
                          auVar66._8_8_ = uStack_7d8;
                          auVar66._0_8_ = local_7e0;
                          auVar66._16_8_ = uStack_7d0;
                          auVar66._24_8_ = uStack_7c8;
                          if (auVar66 != (undefined1  [32])0x0) {
                            uVar89 = vptestmd_avx512vl(auVar66,auVar66);
                            iVar3 = *(int *)(local_990.hit + 4);
                            iVar4 = *(int *)(local_990.hit + 8);
                            iVar1 = *(int *)(local_990.hit + 0xc);
                            iVar61 = *(int *)(local_990.hit + 0x10);
                            iVar62 = *(int *)(local_990.hit + 0x14);
                            iVar63 = *(int *)(local_990.hit + 0x18);
                            iVar64 = *(int *)(local_990.hit + 0x1c);
                            bVar80 = (byte)uVar89;
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar18 = SUB81(uVar89 >> 7,0);
                            *(uint *)(local_990.ray + 0x180) =
                                 (uint)(bVar80 & 1) * *(int *)local_990.hit |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x180);
                            *(uint *)(local_990.ray + 0x184) =
                                 (uint)bVar88 * iVar3 |
                                 (uint)!bVar88 * *(int *)(local_990.ray + 0x184);
                            *(uint *)(local_990.ray + 0x188) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x188);
                            *(uint *)(local_990.ray + 0x18c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x18c);
                            *(uint *)(local_990.ray + 400) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 400);
                            *(uint *)(local_990.ray + 0x194) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x194);
                            *(uint *)(local_990.ray + 0x198) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x198);
                            *(uint *)(local_990.ray + 0x19c) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x19c);
                            iVar3 = *(int *)(local_990.hit + 0x24);
                            iVar4 = *(int *)(local_990.hit + 0x28);
                            iVar1 = *(int *)(local_990.hit + 0x2c);
                            iVar61 = *(int *)(local_990.hit + 0x30);
                            iVar62 = *(int *)(local_990.hit + 0x34);
                            iVar63 = *(int *)(local_990.hit + 0x38);
                            iVar64 = *(int *)(local_990.hit + 0x3c);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar18 = SUB81(uVar89 >> 7,0);
                            *(uint *)(local_990.ray + 0x1a0) =
                                 (uint)(bVar80 & 1) * *(int *)(local_990.hit + 0x20) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x1a0);
                            *(uint *)(local_990.ray + 0x1a4) =
                                 (uint)bVar88 * iVar3 |
                                 (uint)!bVar88 * *(int *)(local_990.ray + 0x1a4);
                            *(uint *)(local_990.ray + 0x1a8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1a8);
                            *(uint *)(local_990.ray + 0x1ac) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x1ac);
                            *(uint *)(local_990.ray + 0x1b0) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x1b0);
                            *(uint *)(local_990.ray + 0x1b4) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x1b4);
                            *(uint *)(local_990.ray + 0x1b8) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1b8);
                            *(uint *)(local_990.ray + 0x1bc) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1bc);
                            iVar3 = *(int *)(local_990.hit + 0x44);
                            iVar4 = *(int *)(local_990.hit + 0x48);
                            iVar1 = *(int *)(local_990.hit + 0x4c);
                            iVar61 = *(int *)(local_990.hit + 0x50);
                            iVar62 = *(int *)(local_990.hit + 0x54);
                            iVar63 = *(int *)(local_990.hit + 0x58);
                            iVar64 = *(int *)(local_990.hit + 0x5c);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar18 = SUB81(uVar89 >> 7,0);
                            *(uint *)(local_990.ray + 0x1c0) =
                                 (uint)(bVar80 & 1) * *(int *)(local_990.hit + 0x40) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x1c0);
                            *(uint *)(local_990.ray + 0x1c4) =
                                 (uint)bVar88 * iVar3 |
                                 (uint)!bVar88 * *(int *)(local_990.ray + 0x1c4);
                            *(uint *)(local_990.ray + 0x1c8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1c8);
                            *(uint *)(local_990.ray + 0x1cc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x1cc);
                            *(uint *)(local_990.ray + 0x1d0) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x1d0);
                            *(uint *)(local_990.ray + 0x1d4) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x1d4);
                            *(uint *)(local_990.ray + 0x1d8) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1d8);
                            *(uint *)(local_990.ray + 0x1dc) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1dc);
                            iVar3 = *(int *)(local_990.hit + 100);
                            iVar4 = *(int *)(local_990.hit + 0x68);
                            iVar1 = *(int *)(local_990.hit + 0x6c);
                            iVar61 = *(int *)(local_990.hit + 0x70);
                            iVar62 = *(int *)(local_990.hit + 0x74);
                            iVar63 = *(int *)(local_990.hit + 0x78);
                            iVar64 = *(int *)(local_990.hit + 0x7c);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar18 = SUB81(uVar89 >> 7,0);
                            *(uint *)(local_990.ray + 0x1e0) =
                                 (uint)(bVar80 & 1) * *(int *)(local_990.hit + 0x60) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x1e0);
                            *(uint *)(local_990.ray + 0x1e4) =
                                 (uint)bVar88 * iVar3 |
                                 (uint)!bVar88 * *(int *)(local_990.ray + 0x1e4);
                            *(uint *)(local_990.ray + 0x1e8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1e8);
                            *(uint *)(local_990.ray + 0x1ec) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x1ec);
                            *(uint *)(local_990.ray + 0x1f0) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x1f0);
                            *(uint *)(local_990.ray + 500) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 500);
                            *(uint *)(local_990.ray + 0x1f8) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1f8);
                            *(uint *)(local_990.ray + 0x1fc) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1fc);
                            iVar3 = *(int *)(local_990.hit + 0x84);
                            iVar4 = *(int *)(local_990.hit + 0x88);
                            iVar1 = *(int *)(local_990.hit + 0x8c);
                            iVar61 = *(int *)(local_990.hit + 0x90);
                            iVar62 = *(int *)(local_990.hit + 0x94);
                            iVar63 = *(int *)(local_990.hit + 0x98);
                            iVar64 = *(int *)(local_990.hit + 0x9c);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar18 = SUB81(uVar89 >> 7,0);
                            *(uint *)(local_990.ray + 0x200) =
                                 (uint)(bVar80 & 1) * *(int *)(local_990.hit + 0x80) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x200);
                            *(uint *)(local_990.ray + 0x204) =
                                 (uint)bVar88 * iVar3 |
                                 (uint)!bVar88 * *(int *)(local_990.ray + 0x204);
                            *(uint *)(local_990.ray + 0x208) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x208);
                            *(uint *)(local_990.ray + 0x20c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x20c);
                            *(uint *)(local_990.ray + 0x210) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x210);
                            *(uint *)(local_990.ray + 0x214) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x214);
                            *(uint *)(local_990.ray + 0x218) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x218);
                            *(uint *)(local_990.ray + 0x21c) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x21c);
                            auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xa0));
                            *(undefined1 (*) [32])(local_990.ray + 0x220) = auVar105;
                            auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xc0));
                            *(undefined1 (*) [32])(local_990.ray + 0x240) = auVar105;
                            auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xe0));
                            *(undefined1 (*) [32])(local_990.ray + 0x260) = auVar105;
                            auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0x100));
                            *(undefined1 (*) [32])(local_990.ray + 0x280) = auVar105;
                            goto LAB_01e0ef38;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar242;
                      }
                    }
                  }
                }
LAB_01e0ef38:
                bVar88 = lVar87 != 0;
                lVar87 = lVar87 + -1;
              } while ((!bVar12) && (bVar88));
              auVar71._4_4_ = fStack_6bc;
              auVar71._0_4_ = local_6c0;
              auVar71._8_4_ = fStack_6b8;
              auVar71._12_4_ = fStack_6b4;
              auVar71._16_4_ = fStack_6b0;
              auVar71._20_4_ = fStack_6ac;
              auVar71._24_4_ = fStack_6a8;
              auVar71._28_4_ = fStack_6a4;
              uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar32._4_4_ = uVar154;
              auVar32._0_4_ = uVar154;
              auVar32._8_4_ = uVar154;
              auVar32._12_4_ = uVar154;
              auVar32._16_4_ = uVar154;
              auVar32._20_4_ = uVar154;
              auVar32._24_4_ = uVar154;
              auVar32._28_4_ = uVar154;
              uVar22 = vcmpps_avx512vl(auVar71,auVar32,2);
              bVar83 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar83 & (byte)uVar22;
            } while (bVar83 != 0);
          }
          auVar168._0_4_ = (float)local_6e0._0_4_ + (float)local_720._0_4_;
          auVar168._4_4_ = (float)local_6e0._4_4_ + (float)local_720._4_4_;
          auVar168._8_4_ = fStack_6d8 + fStack_718;
          auVar168._12_4_ = fStack_6d4 + fStack_714;
          auVar168._16_4_ = fStack_6d0 + fStack_710;
          auVar168._20_4_ = fStack_6cc + fStack_70c;
          auVar168._24_4_ = fStack_6c8 + fStack_708;
          auVar168._28_4_ = fStack_6c4 + fStack_704;
          uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar33._4_4_ = uVar154;
          auVar33._0_4_ = uVar154;
          auVar33._8_4_ = uVar154;
          auVar33._12_4_ = uVar154;
          auVar33._16_4_ = uVar154;
          auVar33._20_4_ = uVar154;
          auVar33._24_4_ = uVar154;
          auVar33._28_4_ = uVar154;
          uVar22 = vcmpps_avx512vl(auVar168,auVar33,2);
          bVar84 = (byte)uVar20 | ~bVar84;
          bVar78 = (byte)uVar21 & bVar78 & (byte)uVar22;
          auVar169._8_4_ = 2;
          auVar169._0_8_ = 0x200000002;
          auVar169._12_4_ = 2;
          auVar169._16_4_ = 2;
          auVar169._20_4_ = 2;
          auVar169._24_4_ = 2;
          auVar169._28_4_ = 2;
          auVar34._8_4_ = 3;
          auVar34._0_8_ = 0x300000003;
          auVar34._12_4_ = 3;
          auVar34._16_4_ = 3;
          auVar34._20_4_ = 3;
          auVar34._24_4_ = 3;
          auVar34._28_4_ = 3;
          auVar105 = vpblendmd_avx512vl(auVar169,auVar34);
          local_6e0._0_4_ = (uint)(bVar84 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar84 & 1) * 2;
          bVar12 = (bool)(bVar84 >> 1 & 1);
          local_6e0._4_4_ = (uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar84 >> 2 & 1);
          fStack_6d8 = (float)((uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar84 >> 3 & 1);
          fStack_6d4 = (float)((uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar84 >> 4 & 1);
          fStack_6d0 = (float)((uint)bVar12 * auVar105._16_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar84 >> 5 & 1);
          fStack_6cc = (float)((uint)bVar12 * auVar105._20_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar84 >> 6 & 1);
          fStack_6c8 = (float)((uint)bVar12 * auVar105._24_4_ | (uint)!bVar12 * 2);
          fStack_6c4 = (float)((uint)(bVar84 >> 7) * auVar105._28_4_ |
                              (uint)!(bool)(bVar84 >> 7) * 2);
          uVar20 = vpcmpd_avx512vl(_local_6e0,local_600,2);
          bVar84 = (byte)uVar20 & bVar78;
          if (bVar84 != 0) {
            auVar253 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar94 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar91 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar5 = vminps_avx(auVar253,auVar91);
            auVar253 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar91 = vmaxps_avx(auVar94,auVar253);
            auVar94 = vandps_avx(auVar255,auVar5);
            auVar253 = vandps_avx(auVar255,auVar91);
            auVar94 = vmaxps_avx(auVar94,auVar253);
            auVar253 = vmovshdup_avx(auVar94);
            auVar253 = vmaxss_avx(auVar253,auVar94);
            auVar94 = vshufpd_avx(auVar94,auVar94,1);
            auVar94 = vmaxss_avx(auVar94,auVar253);
            fVar152 = auVar94._0_4_ * 1.9073486e-06;
            local_7b0 = vshufps_avx(auVar91,auVar91,0xff);
            _local_740 = _local_480;
            local_6c0 = (float)local_480._0_4_ + (float)local_720._0_4_;
            fStack_6bc = (float)local_480._4_4_ + (float)local_720._4_4_;
            fStack_6b8 = fStack_478 + fStack_718;
            fStack_6b4 = fStack_474 + fStack_714;
            fStack_6b0 = fStack_470 + fStack_710;
            fStack_6ac = fStack_46c + fStack_70c;
            fStack_6a8 = fStack_468 + fStack_708;
            fStack_6a4 = fStack_464 + fStack_704;
            do {
              auVar170._8_4_ = 0x7f800000;
              auVar170._0_8_ = 0x7f8000007f800000;
              auVar170._12_4_ = 0x7f800000;
              auVar170._16_4_ = 0x7f800000;
              auVar170._20_4_ = 0x7f800000;
              auVar170._24_4_ = 0x7f800000;
              auVar170._28_4_ = 0x7f800000;
              auVar105 = vblendmps_avx512vl(auVar170,_local_740);
              auVar141._0_4_ =
                   (uint)(bVar84 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar84 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar84 >> 1 & 1);
              auVar141._4_4_ = (uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar84 >> 2 & 1);
              auVar141._8_4_ = (uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar84 >> 3 & 1);
              auVar141._12_4_ = (uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar84 >> 4 & 1);
              auVar141._16_4_ = (uint)bVar12 * auVar105._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar84 >> 5 & 1);
              auVar141._20_4_ = (uint)bVar12 * auVar105._20_4_ | (uint)!bVar12 * 0x7f800000;
              auVar141._24_4_ =
                   (uint)(bVar84 >> 6) * auVar105._24_4_ | (uint)!(bool)(bVar84 >> 6) * 0x7f800000;
              auVar141._28_4_ = 0x7f800000;
              auVar105 = vshufps_avx(auVar141,auVar141,0xb1);
              auVar105 = vminps_avx(auVar141,auVar105);
              auVar103 = vshufpd_avx(auVar105,auVar105,5);
              auVar105 = vminps_avx(auVar105,auVar103);
              auVar103 = vpermpd_avx2(auVar105,0x4e);
              auVar105 = vminps_avx(auVar105,auVar103);
              uVar20 = vcmpps_avx512vl(auVar141,auVar105,0);
              bVar80 = (byte)uVar20 & bVar84;
              bVar83 = bVar84;
              if (bVar80 != 0) {
                bVar83 = bVar80;
              }
              iVar2 = 0;
              for (uVar90 = (uint)bVar83; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar90 = *(uint *)(local_6a0 + (uint)(iVar2 << 2));
              uVar145 = *(uint *)(local_460 + (uint)(iVar2 << 2));
              fVar240 = auVar93._0_4_;
              if ((float)local_880._0_4_ < 0.0) {
                fVar240 = sqrtf((float)local_880._0_4_);
              }
              auVar254 = ZEXT464(uVar90);
              auVar248 = ZEXT464(uVar145);
              lVar87 = 4;
              do {
                fVar241 = auVar248._0_4_;
                auVar159._4_4_ = fVar241;
                auVar159._0_4_ = fVar241;
                auVar159._8_4_ = fVar241;
                auVar159._12_4_ = fVar241;
                auVar94 = vfmadd132ps_fma(auVar159,ZEXT816(0) << 0x40,local_870);
                fVar252 = auVar254._0_4_;
                fVar237 = 1.0 - fVar252;
                fVar250 = fVar237 * fVar237 * fVar237;
                fVar242 = fVar252 * fVar252;
                fVar243 = fVar252 * fVar242;
                auVar253 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar250),
                                           ZEXT416((uint)fVar243));
                fVar249 = fVar252 * fVar237;
                auVar92 = ZEXT416((uint)fVar237);
                auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * fVar249 * 6.0)),
                                         ZEXT416((uint)(fVar249 * fVar237)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar243),
                                          ZEXT416((uint)fVar250));
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * fVar237 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar252 * fVar249)));
                fVar250 = fVar250 * 0.16666667;
                fVar251 = (auVar253._0_4_ + auVar5._0_4_) * 0.16666667;
                fVar216 = (auVar91._0_4_ + auVar95._0_4_) * 0.16666667;
                fVar243 = fVar243 * 0.16666667;
                auVar203._0_4_ = fVar243 * (float)local_860._0_4_;
                auVar203._4_4_ = fVar243 * (float)local_860._4_4_;
                auVar203._8_4_ = fVar243 * fStack_858;
                auVar203._12_4_ = fVar243 * fStack_854;
                auVar230._4_4_ = fVar216;
                auVar230._0_4_ = fVar216;
                auVar230._8_4_ = fVar216;
                auVar230._12_4_ = fVar216;
                auVar253 = vfmadd132ps_fma(auVar230,auVar203,local_820._0_16_);
                auVar204._4_4_ = fVar251;
                auVar204._0_4_ = fVar251;
                auVar204._8_4_ = fVar251;
                auVar204._12_4_ = fVar251;
                auVar253 = vfmadd132ps_fma(auVar204,auVar253,local_840._0_16_);
                auVar185._4_4_ = fVar250;
                auVar185._0_4_ = fVar250;
                auVar185._8_4_ = fVar250;
                auVar185._12_4_ = fVar250;
                auVar253 = vfmadd132ps_fma(auVar185,auVar253,local_800._0_16_);
                local_700._0_16_ = auVar253;
                auVar94 = vsubps_avx(auVar94,auVar253);
                local_8a0._0_16_ = auVar94;
                auVar94 = vdpps_avx(auVar94,auVar94,0x7f);
                auVar253 = auVar254._0_16_;
                local_8c0._0_16_ = auVar94;
                if (auVar94._0_4_ < 0.0) {
                  local_960._0_4_ = fVar242;
                  auVar238._0_4_ = sqrtf(auVar94._0_4_);
                  auVar238._4_60_ = extraout_var_01;
                  auVar94 = auVar238._0_16_;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar94,auVar94);
                  local_960._0_4_ = fVar242;
                }
                auVar5 = vfnmsub213ss_fma(auVar253,auVar253,ZEXT416((uint)(fVar249 * 4.0)));
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * 4.0)),auVar92,auVar92);
                fVar242 = fVar237 * -fVar237 * 0.5;
                fVar249 = auVar5._0_4_ * 0.5;
                fVar250 = auVar91._0_4_ * 0.5;
                local_960._0_4_ = (float)local_960._0_4_ * 0.5;
                auVar220._0_4_ = (float)local_960._0_4_ * (float)local_860._0_4_;
                auVar220._4_4_ = (float)local_960._0_4_ * (float)local_860._4_4_;
                auVar220._8_4_ = (float)local_960._0_4_ * fStack_858;
                auVar220._12_4_ = (float)local_960._0_4_ * fStack_854;
                auVar186._4_4_ = fVar250;
                auVar186._0_4_ = fVar250;
                auVar186._8_4_ = fVar250;
                auVar186._12_4_ = fVar250;
                auVar91 = vfmadd132ps_fma(auVar186,auVar220,local_820._0_16_);
                auVar205._4_4_ = fVar249;
                auVar205._0_4_ = fVar249;
                auVar205._8_4_ = fVar249;
                auVar205._12_4_ = fVar249;
                auVar91 = vfmadd132ps_fma(auVar205,auVar91,local_840._0_16_);
                auVar261._4_4_ = fVar242;
                auVar261._0_4_ = fVar242;
                auVar261._8_4_ = fVar242;
                auVar261._12_4_ = fVar242;
                local_960._0_16_ = vfmadd132ps_fma(auVar261,auVar91,local_800._0_16_);
                local_760 = vdpps_avx(local_960._0_16_,local_960._0_16_,0x7f);
                auVar60._12_4_ = 0;
                auVar60._0_12_ = ZEXT812(0);
                fVar242 = local_760._0_4_;
                auVar91 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar242));
                fVar249 = auVar91._0_4_;
                local_770 = vrcp14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar242));
                auVar91 = vfnmadd213ss_fma(local_770,local_760,ZEXT416(0x40000000));
                uVar90 = auVar94._0_4_;
                local_750 = fVar237;
                fStack_74c = fVar237;
                fStack_748 = fVar237;
                fStack_744 = fVar237;
                if (fVar242 < -fVar242) {
                  auVar247._0_4_ = sqrtf(fVar242);
                  auVar247._4_60_ = extraout_var_02;
                  auVar94 = ZEXT416(uVar90);
                  auVar95 = auVar247._0_16_;
                  auVar5 = local_960._0_16_;
                }
                else {
                  auVar95 = vsqrtss_avx512f(local_760,local_760);
                  auVar5 = local_960._0_16_;
                }
                fVar242 = fVar249 * 1.5 + fVar242 * -0.5 * fVar249 * fVar249 * fVar249;
                auVar160._0_4_ = auVar5._0_4_ * fVar242;
                auVar160._4_4_ = auVar5._4_4_ * fVar242;
                auVar160._8_4_ = auVar5._8_4_ * fVar242;
                auVar160._12_4_ = auVar5._12_4_ * fVar242;
                auVar266 = vdpps_avx(local_8a0._0_16_,auVar160,0x7f);
                fVar251 = auVar94._0_4_;
                fVar249 = auVar266._0_4_;
                auVar161._0_4_ = fVar249 * fVar249;
                auVar161._4_4_ = auVar266._4_4_ * auVar266._4_4_;
                auVar161._8_4_ = auVar266._8_4_ * auVar266._8_4_;
                auVar161._12_4_ = auVar266._12_4_ * auVar266._12_4_;
                auVar96 = vsubps_avx512vl(local_8c0._0_16_,auVar161);
                fVar250 = auVar96._0_4_;
                auVar187._4_12_ = ZEXT812(0) << 0x20;
                auVar187._0_4_ = fVar250;
                auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
                auVar98 = vmulss_avx512f(auVar97,ZEXT416(0x3fc00000));
                auVar99 = vmulss_avx512f(auVar96,ZEXT416(0xbf000000));
                if (fVar250 < 0.0) {
                  local_790 = fVar242;
                  fStack_78c = fVar242;
                  fStack_788 = fVar242;
                  fStack_784 = fVar242;
                  local_780 = auVar97;
                  fVar250 = sqrtf(fVar250);
                  auVar99 = ZEXT416(auVar99._0_4_);
                  auVar98 = ZEXT416(auVar98._0_4_);
                  auVar95 = ZEXT416(auVar95._0_4_);
                  auVar94 = ZEXT416(uVar90);
                  auVar5 = local_960._0_16_;
                  auVar97 = local_780;
                  fVar242 = local_790;
                  fVar216 = fStack_78c;
                  fVar243 = fStack_788;
                  fVar237 = fStack_784;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                  fVar250 = auVar96._0_4_;
                  fVar216 = fVar242;
                  fVar243 = fVar242;
                  fVar237 = fVar242;
                }
                auVar264 = ZEXT1664(auVar5);
                auVar246._8_4_ = 0x7fffffff;
                auVar246._0_8_ = 0x7fffffff7fffffff;
                auVar246._12_4_ = 0x7fffffff;
                auVar247 = ZEXT1664(auVar246);
                auVar268 = ZEXT3264(local_8e0);
                auVar267 = ZEXT3264(local_900);
                auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar92,auVar253);
                auVar253 = vfmadd231ss_fma(auVar92,auVar253,SUB6416(ZEXT464(0xc0000000),0));
                auVar206._0_4_ = fVar252 * (float)local_860._0_4_;
                auVar206._4_4_ = fVar252 * (float)local_860._4_4_;
                auVar206._8_4_ = fVar252 * fStack_858;
                auVar206._12_4_ = fVar252 * fStack_854;
                auVar221._0_4_ = auVar253._0_4_;
                auVar221._4_4_ = auVar221._0_4_;
                auVar221._8_4_ = auVar221._0_4_;
                auVar221._12_4_ = auVar221._0_4_;
                auVar253 = vfmadd132ps_fma(auVar221,auVar206,local_820._0_16_);
                auVar188._0_4_ = auVar96._0_4_;
                auVar188._4_4_ = auVar188._0_4_;
                auVar188._8_4_ = auVar188._0_4_;
                auVar188._12_4_ = auVar188._0_4_;
                auVar253 = vfmadd132ps_fma(auVar188,auVar253,local_840._0_16_);
                auVar70._4_4_ = fStack_74c;
                auVar70._0_4_ = local_750;
                auVar70._8_4_ = fStack_748;
                auVar70._12_4_ = fStack_744;
                auVar253 = vfmadd132ps_fma(auVar70,auVar253,local_800._0_16_);
                auVar189._0_4_ = auVar253._0_4_ * (float)local_760._0_4_;
                auVar189._4_4_ = auVar253._4_4_ * (float)local_760._0_4_;
                auVar189._8_4_ = auVar253._8_4_ * (float)local_760._0_4_;
                auVar189._12_4_ = auVar253._12_4_ * (float)local_760._0_4_;
                auVar253 = vdpps_avx(auVar5,auVar253,0x7f);
                fVar197 = auVar253._0_4_;
                auVar207._0_4_ = auVar5._0_4_ * fVar197;
                auVar207._4_4_ = auVar5._4_4_ * fVar197;
                auVar207._8_4_ = auVar5._8_4_ * fVar197;
                auVar207._12_4_ = auVar5._12_4_ * fVar197;
                auVar253 = vsubps_avx(auVar189,auVar207);
                fVar197 = auVar91._0_4_ * (float)local_770._0_4_;
                auVar24._8_4_ = 0x80000000;
                auVar24._0_8_ = 0x8000000080000000;
                auVar24._12_4_ = 0x80000000;
                auVar143._16_16_ = local_900._16_16_;
                auVar96 = vxorps_avx512vl(auVar5,auVar24);
                auVar231._0_4_ = fVar242 * auVar253._0_4_ * fVar197;
                auVar231._4_4_ = fVar216 * auVar253._4_4_ * fVar197;
                auVar231._8_4_ = fVar243 * auVar253._8_4_ * fVar197;
                auVar231._12_4_ = fVar237 * auVar253._12_4_ * fVar197;
                auVar259 = ZEXT1664(auVar160);
                auVar253 = vdpps_avx(auVar96,auVar160,0x7f);
                auVar92 = vmaxss_avx(ZEXT416((uint)fVar152),
                                     ZEXT416((uint)(fVar241 * fVar240 * 1.9073486e-06)));
                auVar95 = vdivss_avx512f(ZEXT416((uint)fVar152),auVar95);
                auVar91 = vdpps_avx(local_8a0._0_16_,auVar231,0x7f);
                auVar94 = vfmadd213ss_fma(auVar94,ZEXT416((uint)fVar152),auVar92);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)(fVar251 + 1.0)),auVar95,auVar94);
                auVar94 = vdpps_avx(local_870,auVar160,0x7f);
                fVar242 = auVar253._0_4_ + auVar91._0_4_;
                auVar253 = vdpps_avx(local_8a0._0_16_,auVar96,0x7f);
                auVar96 = vmulss_avx512f(auVar99,auVar97);
                auVar97 = vmulss_avx512f(auVar97,auVar97);
                auVar91 = vdpps_avx(local_8a0._0_16_,local_870,0x7f);
                auVar98 = vaddss_avx512f(auVar98,ZEXT416((uint)(auVar96._0_4_ * auVar97._0_4_)));
                auVar97 = vfnmadd231ss_fma(auVar253,auVar266,ZEXT416((uint)fVar242));
                auVar96 = vfnmadd231ss_fma(auVar91,auVar266,auVar94);
                auVar253 = vpermilps_avx(local_700._0_16_,0xff);
                fVar250 = fVar250 - auVar253._0_4_;
                auVar253 = vshufps_avx(auVar5,auVar5,0xff);
                auVar91 = vfmsub213ss_fma(auVar97,auVar98,auVar253);
                fVar251 = auVar96._0_4_ * auVar98._0_4_;
                auVar97 = vfmsub231ss_fma(ZEXT416((uint)(auVar94._0_4_ * auVar91._0_4_)),
                                          ZEXT416((uint)fVar242),ZEXT416((uint)fVar251));
                fVar243 = auVar97._0_4_;
                fVar216 = fVar249 * (auVar91._0_4_ / fVar243);
                auVar238 = ZEXT464((uint)fVar216);
                fVar252 = fVar252 - (fVar249 * (fVar251 / fVar243) -
                                    fVar250 * (auVar94._0_4_ / fVar243));
                auVar254 = ZEXT464((uint)fVar252);
                fVar241 = fVar241 - (fVar250 * (fVar242 / fVar243) - fVar216);
                auVar248 = ZEXT464((uint)fVar241);
                auVar94 = vandps_avx(auVar266,auVar246);
                if (auVar95._0_4_ <= auVar94._0_4_) {
LAB_01e0fb2e:
                  bVar12 = false;
                }
                else {
                  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar95._0_4_ + auVar92._0_4_)),local_7b0
                                            ,ZEXT416(0x36000000));
                  auVar94 = vandps_avx(auVar246,ZEXT416((uint)fVar250));
                  if (auVar91._0_4_ <= auVar94._0_4_) goto LAB_01e0fb2e;
                  fVar241 = fVar241 + (float)local_7a0._0_4_;
                  auVar248 = ZEXT464((uint)fVar241);
                  bVar12 = true;
                  if ((((fVar217 <= fVar241) &&
                       (fVar242 = *(float *)(ray + k * 4 + 0x100), fVar241 <= fVar242)) &&
                      (0.0 <= fVar252)) && (fVar252 <= 1.0)) {
                    auVar143._0_16_ = ZEXT816(0) << 0x20;
                    auVar142._4_28_ = auVar143._4_28_;
                    auVar142._0_4_ = local_8c0._0_4_;
                    auVar94 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar142._0_16_);
                    fVar249 = auVar94._0_4_;
                    auVar94 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                    pGVar9 = (context->scene->geometries).items[uVar86].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar249 = fVar249 * 1.5 + auVar94._0_4_ * fVar249 * fVar249 * fVar249;
                      auVar190._0_4_ = local_8a0._0_4_ * fVar249;
                      auVar190._4_4_ = local_8a0._4_4_ * fVar249;
                      auVar190._8_4_ = local_8a0._8_4_ * fVar249;
                      auVar190._12_4_ = local_8a0._12_4_ * fVar249;
                      auVar95 = vfmadd213ps_fma(auVar253,auVar190,auVar5);
                      auVar94 = vshufps_avx(auVar190,auVar190,0xc9);
                      auVar253 = vshufps_avx(auVar5,auVar5,0xc9);
                      auVar191._0_4_ = auVar190._0_4_ * auVar253._0_4_;
                      auVar191._4_4_ = auVar190._4_4_ * auVar253._4_4_;
                      auVar191._8_4_ = auVar190._8_4_ * auVar253._8_4_;
                      auVar191._12_4_ = auVar190._12_4_ * auVar253._12_4_;
                      auVar91 = vfmsub231ps_fma(auVar191,auVar5,auVar94);
                      auVar94 = vshufps_avx(auVar91,auVar91,0xc9);
                      auVar253 = vshufps_avx(auVar95,auVar95,0xc9);
                      auVar91 = vshufps_avx(auVar91,auVar91,0xd2);
                      auVar162._0_4_ = auVar95._0_4_ * auVar91._0_4_;
                      auVar162._4_4_ = auVar95._4_4_ * auVar91._4_4_;
                      auVar162._8_4_ = auVar95._8_4_ * auVar91._8_4_;
                      auVar162._12_4_ = auVar95._12_4_ * auVar91._12_4_;
                      auVar94 = vfmsub231ps_fma(auVar162,auVar94,auVar253);
                      uVar154 = auVar94._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar241;
                        uVar8 = vextractps_avx(auVar94,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                        uVar8 = vextractps_avx(auVar94,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar154;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar252;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar7;
                        *(uint *)(ray + k * 4 + 0x240) = uVar86;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar11 = context->user;
                        auVar210._8_4_ = 1;
                        auVar210._0_8_ = 0x100000001;
                        auVar210._12_4_ = 1;
                        auVar210._16_4_ = 1;
                        auVar210._20_4_ = 1;
                        auVar210._24_4_ = 1;
                        auVar210._28_4_ = 1;
                        auVar105 = vpermps_avx2(auVar210,ZEXT1632(auVar94));
                        auVar226._8_4_ = 2;
                        auVar226._0_8_ = 0x200000002;
                        auVar226._12_4_ = 2;
                        auVar226._16_4_ = 2;
                        auVar226._20_4_ = 2;
                        auVar226._24_4_ = 2;
                        auVar226._28_4_ = 2;
                        local_580 = vpermps_avx2(auVar226,ZEXT1632(auVar94));
                        local_5a0[0] = (RTCHitN)auVar105[0];
                        local_5a0[1] = (RTCHitN)auVar105[1];
                        local_5a0[2] = (RTCHitN)auVar105[2];
                        local_5a0[3] = (RTCHitN)auVar105[3];
                        local_5a0[4] = (RTCHitN)auVar105[4];
                        local_5a0[5] = (RTCHitN)auVar105[5];
                        local_5a0[6] = (RTCHitN)auVar105[6];
                        local_5a0[7] = (RTCHitN)auVar105[7];
                        local_5a0[8] = (RTCHitN)auVar105[8];
                        local_5a0[9] = (RTCHitN)auVar105[9];
                        local_5a0[10] = (RTCHitN)auVar105[10];
                        local_5a0[0xb] = (RTCHitN)auVar105[0xb];
                        local_5a0[0xc] = (RTCHitN)auVar105[0xc];
                        local_5a0[0xd] = (RTCHitN)auVar105[0xd];
                        local_5a0[0xe] = (RTCHitN)auVar105[0xe];
                        local_5a0[0xf] = (RTCHitN)auVar105[0xf];
                        local_5a0[0x10] = (RTCHitN)auVar105[0x10];
                        local_5a0[0x11] = (RTCHitN)auVar105[0x11];
                        local_5a0[0x12] = (RTCHitN)auVar105[0x12];
                        local_5a0[0x13] = (RTCHitN)auVar105[0x13];
                        local_5a0[0x14] = (RTCHitN)auVar105[0x14];
                        local_5a0[0x15] = (RTCHitN)auVar105[0x15];
                        local_5a0[0x16] = (RTCHitN)auVar105[0x16];
                        local_5a0[0x17] = (RTCHitN)auVar105[0x17];
                        local_5a0[0x18] = (RTCHitN)auVar105[0x18];
                        local_5a0[0x19] = (RTCHitN)auVar105[0x19];
                        local_5a0[0x1a] = (RTCHitN)auVar105[0x1a];
                        local_5a0[0x1b] = (RTCHitN)auVar105[0x1b];
                        local_5a0[0x1c] = (RTCHitN)auVar105[0x1c];
                        local_5a0[0x1d] = (RTCHitN)auVar105[0x1d];
                        local_5a0[0x1e] = (RTCHitN)auVar105[0x1e];
                        local_5a0[0x1f] = (RTCHitN)auVar105[0x1f];
                        local_560 = uVar154;
                        uStack_55c = uVar154;
                        uStack_558 = uVar154;
                        uStack_554 = uVar154;
                        uStack_550 = uVar154;
                        uStack_54c = uVar154;
                        uStack_548 = uVar154;
                        uStack_544 = uVar154;
                        local_540 = fVar252;
                        fStack_53c = fVar252;
                        fStack_538 = fVar252;
                        fStack_534 = fVar252;
                        fStack_530 = fVar252;
                        fStack_52c = fVar252;
                        fStack_528 = fVar252;
                        fStack_524 = fVar252;
                        local_520 = ZEXT432(0) << 0x20;
                        local_500 = local_640._0_8_;
                        uStack_4f8 = local_640._8_8_;
                        uStack_4f0 = local_640._16_8_;
                        uStack_4e8 = local_640._24_8_;
                        local_4e0 = local_620;
                        auVar105 = vpcmpeqd_avx2(local_620,local_620);
                        local_928[1] = auVar105;
                        *local_928 = auVar105;
                        local_4c0 = pRVar11->instID[0];
                        uStack_4bc = local_4c0;
                        uStack_4b8 = local_4c0;
                        uStack_4b4 = local_4c0;
                        uStack_4b0 = local_4c0;
                        uStack_4ac = local_4c0;
                        uStack_4a8 = local_4c0;
                        uStack_4a4 = local_4c0;
                        local_4a0 = pRVar11->instPrimID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        *(float *)(ray + k * 4 + 0x100) = fVar241;
                        local_7e0 = local_660._0_8_;
                        uStack_7d8 = local_660._8_8_;
                        uStack_7d0 = local_660._16_8_;
                        uStack_7c8 = local_660._24_8_;
                        local_990.valid = (int *)&local_7e0;
                        local_990.geometryUserPtr = pGVar9->userPtr;
                        local_990.context = context->user;
                        local_990.hit = local_5a0;
                        local_990.N = 8;
                        local_990.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar238 = ZEXT464((uint)fVar216);
                          auVar247 = ZEXT1664(auVar246);
                          auVar259 = ZEXT1664(auVar160);
                          auVar264 = ZEXT1664(auVar5);
                          (*pGVar9->intersectionFilterN)(&local_990);
                          auVar248 = ZEXT1664(ZEXT416((uint)fVar241));
                          auVar254 = ZEXT1664(ZEXT416((uint)fVar252));
                          auVar267 = ZEXT3264(local_900);
                          auVar268 = ZEXT3264(local_8e0);
                        }
                        auVar67._8_8_ = uStack_7d8;
                        auVar67._0_8_ = local_7e0;
                        auVar67._16_8_ = uStack_7d0;
                        auVar67._24_8_ = uStack_7c8;
                        if (auVar67 != (undefined1  [32])0x0) {
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar238 = ZEXT1664(auVar238._0_16_);
                            auVar247 = ZEXT1664(auVar247._0_16_);
                            auVar259 = ZEXT1664(auVar259._0_16_);
                            auVar264 = ZEXT1664(auVar264._0_16_);
                            (*p_Var10)(&local_990);
                            auVar248 = ZEXT1664(ZEXT416((uint)fVar241));
                            auVar254 = ZEXT1664(ZEXT416((uint)fVar252));
                            auVar267 = ZEXT3264(local_900);
                            auVar268 = ZEXT3264(local_8e0);
                          }
                          auVar68._8_8_ = uStack_7d8;
                          auVar68._0_8_ = local_7e0;
                          auVar68._16_8_ = uStack_7d0;
                          auVar68._24_8_ = uStack_7c8;
                          if (auVar68 != (undefined1  [32])0x0) {
                            uVar89 = vptestmd_avx512vl(auVar68,auVar68);
                            iVar3 = *(int *)(local_990.hit + 4);
                            iVar4 = *(int *)(local_990.hit + 8);
                            iVar1 = *(int *)(local_990.hit + 0xc);
                            iVar61 = *(int *)(local_990.hit + 0x10);
                            iVar62 = *(int *)(local_990.hit + 0x14);
                            iVar63 = *(int *)(local_990.hit + 0x18);
                            iVar64 = *(int *)(local_990.hit + 0x1c);
                            bVar83 = (byte)uVar89;
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar18 = SUB81(uVar89 >> 7,0);
                            *(uint *)(local_990.ray + 0x180) =
                                 (uint)(bVar83 & 1) * *(int *)local_990.hit |
                                 (uint)!(bool)(bVar83 & 1) * *(int *)(local_990.ray + 0x180);
                            *(uint *)(local_990.ray + 0x184) =
                                 (uint)bVar88 * iVar3 |
                                 (uint)!bVar88 * *(int *)(local_990.ray + 0x184);
                            *(uint *)(local_990.ray + 0x188) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x188);
                            *(uint *)(local_990.ray + 0x18c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x18c);
                            *(uint *)(local_990.ray + 400) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 400);
                            *(uint *)(local_990.ray + 0x194) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x194);
                            *(uint *)(local_990.ray + 0x198) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x198);
                            *(uint *)(local_990.ray + 0x19c) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x19c);
                            iVar3 = *(int *)(local_990.hit + 0x24);
                            iVar4 = *(int *)(local_990.hit + 0x28);
                            iVar1 = *(int *)(local_990.hit + 0x2c);
                            iVar61 = *(int *)(local_990.hit + 0x30);
                            iVar62 = *(int *)(local_990.hit + 0x34);
                            iVar63 = *(int *)(local_990.hit + 0x38);
                            iVar64 = *(int *)(local_990.hit + 0x3c);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar18 = SUB81(uVar89 >> 7,0);
                            *(uint *)(local_990.ray + 0x1a0) =
                                 (uint)(bVar83 & 1) * *(int *)(local_990.hit + 0x20) |
                                 (uint)!(bool)(bVar83 & 1) * *(int *)(local_990.ray + 0x1a0);
                            *(uint *)(local_990.ray + 0x1a4) =
                                 (uint)bVar88 * iVar3 |
                                 (uint)!bVar88 * *(int *)(local_990.ray + 0x1a4);
                            *(uint *)(local_990.ray + 0x1a8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1a8);
                            *(uint *)(local_990.ray + 0x1ac) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x1ac);
                            *(uint *)(local_990.ray + 0x1b0) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x1b0);
                            *(uint *)(local_990.ray + 0x1b4) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x1b4);
                            *(uint *)(local_990.ray + 0x1b8) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1b8);
                            *(uint *)(local_990.ray + 0x1bc) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1bc);
                            iVar3 = *(int *)(local_990.hit + 0x44);
                            iVar4 = *(int *)(local_990.hit + 0x48);
                            iVar1 = *(int *)(local_990.hit + 0x4c);
                            iVar61 = *(int *)(local_990.hit + 0x50);
                            iVar62 = *(int *)(local_990.hit + 0x54);
                            iVar63 = *(int *)(local_990.hit + 0x58);
                            iVar64 = *(int *)(local_990.hit + 0x5c);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar18 = SUB81(uVar89 >> 7,0);
                            *(uint *)(local_990.ray + 0x1c0) =
                                 (uint)(bVar83 & 1) * *(int *)(local_990.hit + 0x40) |
                                 (uint)!(bool)(bVar83 & 1) * *(int *)(local_990.ray + 0x1c0);
                            *(uint *)(local_990.ray + 0x1c4) =
                                 (uint)bVar88 * iVar3 |
                                 (uint)!bVar88 * *(int *)(local_990.ray + 0x1c4);
                            *(uint *)(local_990.ray + 0x1c8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1c8);
                            *(uint *)(local_990.ray + 0x1cc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x1cc);
                            *(uint *)(local_990.ray + 0x1d0) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x1d0);
                            *(uint *)(local_990.ray + 0x1d4) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x1d4);
                            *(uint *)(local_990.ray + 0x1d8) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1d8);
                            *(uint *)(local_990.ray + 0x1dc) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1dc);
                            iVar3 = *(int *)(local_990.hit + 100);
                            iVar4 = *(int *)(local_990.hit + 0x68);
                            iVar1 = *(int *)(local_990.hit + 0x6c);
                            iVar61 = *(int *)(local_990.hit + 0x70);
                            iVar62 = *(int *)(local_990.hit + 0x74);
                            iVar63 = *(int *)(local_990.hit + 0x78);
                            iVar64 = *(int *)(local_990.hit + 0x7c);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar18 = SUB81(uVar89 >> 7,0);
                            *(uint *)(local_990.ray + 0x1e0) =
                                 (uint)(bVar83 & 1) * *(int *)(local_990.hit + 0x60) |
                                 (uint)!(bool)(bVar83 & 1) * *(int *)(local_990.ray + 0x1e0);
                            *(uint *)(local_990.ray + 0x1e4) =
                                 (uint)bVar88 * iVar3 |
                                 (uint)!bVar88 * *(int *)(local_990.ray + 0x1e4);
                            *(uint *)(local_990.ray + 0x1e8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1e8);
                            *(uint *)(local_990.ray + 0x1ec) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x1ec);
                            *(uint *)(local_990.ray + 0x1f0) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x1f0);
                            *(uint *)(local_990.ray + 500) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 500);
                            *(uint *)(local_990.ray + 0x1f8) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1f8);
                            *(uint *)(local_990.ray + 0x1fc) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1fc);
                            iVar3 = *(int *)(local_990.hit + 0x84);
                            iVar4 = *(int *)(local_990.hit + 0x88);
                            iVar1 = *(int *)(local_990.hit + 0x8c);
                            iVar61 = *(int *)(local_990.hit + 0x90);
                            iVar62 = *(int *)(local_990.hit + 0x94);
                            iVar63 = *(int *)(local_990.hit + 0x98);
                            iVar64 = *(int *)(local_990.hit + 0x9c);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar18 = SUB81(uVar89 >> 7,0);
                            *(uint *)(local_990.ray + 0x200) =
                                 (uint)(bVar83 & 1) * *(int *)(local_990.hit + 0x80) |
                                 (uint)!(bool)(bVar83 & 1) * *(int *)(local_990.ray + 0x200);
                            *(uint *)(local_990.ray + 0x204) =
                                 (uint)bVar88 * iVar3 |
                                 (uint)!bVar88 * *(int *)(local_990.ray + 0x204);
                            *(uint *)(local_990.ray + 0x208) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x208);
                            *(uint *)(local_990.ray + 0x20c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x20c);
                            *(uint *)(local_990.ray + 0x210) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x210);
                            *(uint *)(local_990.ray + 0x214) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x214);
                            *(uint *)(local_990.ray + 0x218) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x218);
                            *(uint *)(local_990.ray + 0x21c) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x21c);
                            auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xa0));
                            *(undefined1 (*) [32])(local_990.ray + 0x220) = auVar105;
                            auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xc0));
                            *(undefined1 (*) [32])(local_990.ray + 0x240) = auVar105;
                            auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xe0));
                            *(undefined1 (*) [32])(local_990.ray + 0x260) = auVar105;
                            auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0x100));
                            *(undefined1 (*) [32])(local_990.ray + 0x280) = auVar105;
                            goto LAB_01e0fb31;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar242;
                      }
                    }
                  }
                }
LAB_01e0fb31:
                bVar88 = lVar87 != 0;
                lVar87 = lVar87 + -1;
              } while ((!bVar12) && (bVar88));
              auVar72._4_4_ = fStack_6bc;
              auVar72._0_4_ = local_6c0;
              auVar72._8_4_ = fStack_6b8;
              auVar72._12_4_ = fStack_6b4;
              auVar72._16_4_ = fStack_6b0;
              auVar72._20_4_ = fStack_6ac;
              auVar72._24_4_ = fStack_6a8;
              auVar72._28_4_ = fStack_6a4;
              uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar35._4_4_ = uVar154;
              auVar35._0_4_ = uVar154;
              auVar35._8_4_ = uVar154;
              auVar35._12_4_ = uVar154;
              auVar35._16_4_ = uVar154;
              auVar35._20_4_ = uVar154;
              auVar35._24_4_ = uVar154;
              auVar35._28_4_ = uVar154;
              uVar20 = vcmpps_avx512vl(auVar72,auVar35,2);
              bVar84 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar84 & (byte)uVar20;
            } while (bVar84 != 0);
          }
          uVar22 = vpcmpd_avx512vl(local_600,_local_6e0,1);
          uVar21 = vpcmpd_avx512vl(local_600,local_440,1);
          auVar192._0_4_ = (float)local_720._0_4_ + (float)local_1c0._0_4_;
          auVar192._4_4_ = (float)local_720._4_4_ + (float)local_1c0._4_4_;
          auVar192._8_4_ = fStack_718 + fStack_1b8;
          auVar192._12_4_ = fStack_714 + fStack_1b4;
          auVar192._16_4_ = fStack_710 + fStack_1b0;
          auVar192._20_4_ = fStack_70c + fStack_1ac;
          auVar192._24_4_ = fStack_708 + fStack_1a8;
          auVar192._28_4_ = fStack_704 + fStack_1a4;
          uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar211._4_4_ = uVar154;
          auVar211._0_4_ = uVar154;
          auVar211._8_4_ = uVar154;
          auVar211._12_4_ = uVar154;
          auVar211._16_4_ = uVar154;
          auVar211._20_4_ = uVar154;
          auVar211._24_4_ = uVar154;
          auVar211._28_4_ = uVar154;
          uVar20 = vcmpps_avx512vl(auVar192,auVar211,2);
          bVar81 = bVar81 & (byte)uVar21 & (byte)uVar20;
          auVar227._0_4_ = (float)local_720._0_4_ + (float)local_480._0_4_;
          auVar227._4_4_ = (float)local_720._4_4_ + (float)local_480._4_4_;
          auVar227._8_4_ = fStack_718 + fStack_478;
          auVar227._12_4_ = fStack_714 + fStack_474;
          auVar227._16_4_ = fStack_710 + fStack_470;
          auVar227._20_4_ = fStack_70c + fStack_46c;
          auVar227._24_4_ = fStack_708 + fStack_468;
          auVar227._28_4_ = fStack_704 + fStack_464;
          uVar20 = vcmpps_avx512vl(auVar227,auVar211,2);
          bVar78 = bVar78 & (byte)uVar22 & (byte)uVar20 | bVar81;
          prim = local_920;
          if (bVar78 == 0) {
            auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar265 = ZEXT3264(auVar105);
          }
          else {
            uVar89 = local_910 & 0xffffffff;
            abStack_180[uVar89 * 0x60] = bVar78;
            bVar12 = (bool)(bVar81 >> 1 & 1);
            bVar88 = (bool)(bVar81 >> 2 & 1);
            bVar13 = (bool)(bVar81 >> 3 & 1);
            bVar14 = (bool)(bVar81 >> 4 & 1);
            bVar15 = (bool)(bVar81 >> 5 & 1);
            auStack_160[uVar89 * 0x18] =
                 (uint)(bVar81 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar81 & 1) * local_480._0_4_;
            auStack_160[uVar89 * 0x18 + 1] =
                 (uint)bVar12 * local_1c0._4_4_ | (uint)!bVar12 * local_480._4_4_;
            auStack_160[uVar89 * 0x18 + 2] =
                 (uint)bVar88 * (int)fStack_1b8 | (uint)!bVar88 * (int)fStack_478;
            auStack_160[uVar89 * 0x18 + 3] =
                 (uint)bVar13 * (int)fStack_1b4 | (uint)!bVar13 * (int)fStack_474;
            auStack_160[uVar89 * 0x18 + 4] =
                 (uint)bVar14 * (int)fStack_1b0 | (uint)!bVar14 * (int)fStack_470;
            auStack_160[uVar89 * 0x18 + 5] =
                 (uint)bVar15 * (int)fStack_1ac | (uint)!bVar15 * (int)fStack_46c;
            auStack_160[uVar89 * 0x18 + 6] =
                 (uint)(bVar81 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar81 >> 6) * (int)fStack_468;
            (&fStack_144)[uVar89 * 0x18] = fStack_464;
            uVar20 = vmovlps_avx(local_940);
            (&uStack_140)[uVar89 * 0xc] = uVar20;
            afStack_138[uVar89 * 0x18] = (float)((int)local_918 + 1);
            local_910 = (ulong)((int)local_910 + 1);
            auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar265 = ZEXT3264(auVar105);
          }
        }
      }
    }
    auVar212 = ZEXT1664(local_940);
    local_910 = local_910 & 0xffffffff;
    do {
      if ((int)local_910 == 0) {
        uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar37._4_4_ = uVar154;
        auVar37._0_4_ = uVar154;
        auVar37._8_4_ = uVar154;
        auVar37._12_4_ = uVar154;
        auVar37._16_4_ = uVar154;
        auVar37._20_4_ = uVar154;
        auVar37._24_4_ = uVar154;
        auVar37._28_4_ = uVar154;
        uVar20 = vcmpps_avx512vl(local_420,auVar37,2);
        uVar86 = (uint)local_908 & (uint)uVar20;
        local_908 = (ulong)uVar86;
        if (uVar86 == 0) {
          return;
        }
        goto LAB_01e0d7aa;
      }
      uVar89 = (ulong)((int)local_910 - 1);
      auVar105 = *(undefined1 (*) [32])(auStack_160 + uVar89 * 0x18);
      auVar193._0_4_ = auVar105._0_4_ + (float)local_720._0_4_;
      auVar193._4_4_ = auVar105._4_4_ + (float)local_720._4_4_;
      auVar193._8_4_ = auVar105._8_4_ + fStack_718;
      auVar193._12_4_ = auVar105._12_4_ + fStack_714;
      auVar193._16_4_ = auVar105._16_4_ + fStack_710;
      auVar193._20_4_ = auVar105._20_4_ + fStack_70c;
      auVar193._24_4_ = auVar105._24_4_ + fStack_708;
      auVar193._28_4_ = auVar105._28_4_ + fStack_704;
      uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar36._4_4_ = uVar154;
      auVar36._0_4_ = uVar154;
      auVar36._8_4_ = uVar154;
      auVar36._12_4_ = uVar154;
      auVar36._16_4_ = uVar154;
      auVar36._20_4_ = uVar154;
      auVar36._24_4_ = uVar154;
      auVar36._28_4_ = uVar154;
      uVar20 = vcmpps_avx512vl(auVar193,auVar36,2);
      uVar90 = (uint)uVar20 & (uint)abStack_180[uVar89 * 0x60];
      bVar78 = (byte)uVar90;
      if (uVar90 != 0) {
        auVar194._8_4_ = 0x7f800000;
        auVar194._0_8_ = 0x7f8000007f800000;
        auVar194._12_4_ = 0x7f800000;
        auVar194._16_4_ = 0x7f800000;
        auVar194._20_4_ = 0x7f800000;
        auVar194._24_4_ = 0x7f800000;
        auVar194._28_4_ = 0x7f800000;
        auVar103 = vblendmps_avx512vl(auVar194,auVar105);
        auVar144._0_4_ =
             (uint)(bVar78 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar78 & 1) * (int)auVar105._0_4_;
        bVar12 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar144._4_4_ = (uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * (int)auVar105._4_4_;
        bVar12 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar144._8_4_ = (uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * (int)auVar105._8_4_;
        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar144._12_4_ = (uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * (int)auVar105._12_4_;
        bVar12 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar144._16_4_ = (uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * (int)auVar105._16_4_;
        bVar12 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar144._20_4_ = (uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * (int)auVar105._20_4_;
        bVar12 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar144._24_4_ = (uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * (int)auVar105._24_4_;
        auVar144._28_4_ =
             (uVar90 >> 7) * auVar103._28_4_ | (uint)!SUB41(uVar90 >> 7,0) * (int)auVar105._28_4_;
        auVar105 = vshufps_avx(auVar144,auVar144,0xb1);
        auVar105 = vminps_avx(auVar144,auVar105);
        auVar103 = vshufpd_avx(auVar105,auVar105,5);
        auVar105 = vminps_avx(auVar105,auVar103);
        auVar103 = vpermpd_avx2(auVar105,0x4e);
        auVar105 = vminps_avx(auVar105,auVar103);
        uVar20 = vcmpps_avx512vl(auVar144,auVar105,0);
        bVar84 = (byte)uVar20 & bVar78;
        if (bVar84 != 0) {
          uVar90 = (uint)bVar84;
        }
        fVar152 = afStack_138[uVar89 * 0x18 + -1];
        uVar145 = 0;
        for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
          uVar145 = uVar145 + 1;
        }
        local_918 = (ulong)(uint)afStack_138[uVar89 * 0x18];
        bVar84 = ~('\x01' << ((byte)uVar145 & 0x1f)) & bVar78;
        abStack_180[uVar89 * 0x60] = bVar84;
        uVar85 = uVar89;
        if (bVar84 != 0) {
          uVar85 = local_910;
        }
        fVar240 = *(float *)(&uStack_140 + uVar89 * 0xc);
        auVar195._4_4_ = fVar240;
        auVar195._0_4_ = fVar240;
        auVar195._8_4_ = fVar240;
        auVar195._12_4_ = fVar240;
        auVar195._16_4_ = fVar240;
        auVar195._20_4_ = fVar240;
        auVar195._24_4_ = fVar240;
        auVar195._28_4_ = fVar240;
        fVar152 = fVar152 - fVar240;
        auVar171._4_4_ = fVar152;
        auVar171._0_4_ = fVar152;
        auVar171._8_4_ = fVar152;
        auVar171._12_4_ = fVar152;
        auVar171._16_4_ = fVar152;
        auVar171._20_4_ = fVar152;
        auVar171._24_4_ = fVar152;
        auVar171._28_4_ = fVar152;
        auVar94 = vfmadd132ps_fma(auVar171,auVar195,_DAT_02020f20);
        auVar105 = ZEXT1632(auVar94);
        local_5a0[0] = (RTCHitN)auVar105[0];
        local_5a0[1] = (RTCHitN)auVar105[1];
        local_5a0[2] = (RTCHitN)auVar105[2];
        local_5a0[3] = (RTCHitN)auVar105[3];
        local_5a0[4] = (RTCHitN)auVar105[4];
        local_5a0[5] = (RTCHitN)auVar105[5];
        local_5a0[6] = (RTCHitN)auVar105[6];
        local_5a0[7] = (RTCHitN)auVar105[7];
        local_5a0[8] = (RTCHitN)auVar105[8];
        local_5a0[9] = (RTCHitN)auVar105[9];
        local_5a0[10] = (RTCHitN)auVar105[10];
        local_5a0[0xb] = (RTCHitN)auVar105[0xb];
        local_5a0[0xc] = (RTCHitN)auVar105[0xc];
        local_5a0[0xd] = (RTCHitN)auVar105[0xd];
        local_5a0[0xe] = (RTCHitN)auVar105[0xe];
        local_5a0[0xf] = (RTCHitN)auVar105[0xf];
        local_5a0[0x10] = (RTCHitN)auVar105[0x10];
        local_5a0[0x11] = (RTCHitN)auVar105[0x11];
        local_5a0[0x12] = (RTCHitN)auVar105[0x12];
        local_5a0[0x13] = (RTCHitN)auVar105[0x13];
        local_5a0[0x14] = (RTCHitN)auVar105[0x14];
        local_5a0[0x15] = (RTCHitN)auVar105[0x15];
        local_5a0[0x16] = (RTCHitN)auVar105[0x16];
        local_5a0[0x17] = (RTCHitN)auVar105[0x17];
        local_5a0[0x18] = (RTCHitN)auVar105[0x18];
        local_5a0[0x19] = (RTCHitN)auVar105[0x19];
        local_5a0[0x1a] = (RTCHitN)auVar105[0x1a];
        local_5a0[0x1b] = (RTCHitN)auVar105[0x1b];
        local_5a0[0x1c] = (RTCHitN)auVar105[0x1c];
        local_5a0[0x1d] = (RTCHitN)auVar105[0x1d];
        local_5a0[0x1e] = (RTCHitN)auVar105[0x1e];
        local_5a0[0x1f] = (RTCHitN)auVar105[0x1f];
        auVar212 = ZEXT864(*(ulong *)(local_5a0 + (ulong)uVar145 * 4));
        uVar89 = uVar85;
      }
      local_910 = uVar89;
    } while (bVar78 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }